

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BVH *bvh;
  NodeRef root;
  float *pfVar6;
  Geometry *pGVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  size_t k;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [28];
  undefined1 auVar95 [28];
  undefined1 auVar96 [28];
  int iVar97;
  undefined1 (*pauVar98) [32];
  ulong uVar99;
  undefined1 auVar100 [8];
  uint uVar101;
  ulong *puVar102;
  ulong uVar103;
  long lVar104;
  ulong uVar105;
  undefined4 uVar106;
  ulong unaff_R15;
  bool bVar107;
  float fVar108;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar128;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 in_ZMM0 [64];
  float fVar139;
  float fVar140;
  undefined1 auVar129 [16];
  float fVar143;
  float fVar145;
  float fVar148;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar141;
  undefined1 auVar133 [32];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar149;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar150;
  float fVar165;
  undefined1 auVar151 [16];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar152 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar169;
  float fVar170;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar179;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar193;
  float fVar196;
  float fVar199;
  float fVar201;
  float fVar203;
  float fVar206;
  undefined1 auVar189 [32];
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar190 [32];
  undefined1 auVar192 [64];
  float fVar210;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  float fVar223;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar233;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  float fVar244;
  float fVar245;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  float fVar263;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar274;
  undefined1 auVar273 [32];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar277 [64];
  float fVar290;
  undefined1 auVar291 [32];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 in_ZMM15 [64];
  undefined1 auVar292 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5f49;
  ulong local_5f48;
  undefined1 local_5f40 [8];
  float fStack_5f38;
  float fStack_5f34;
  float fStack_5f30;
  float fStack_5f2c;
  float fStack_5f28;
  RayK<8> *local_5f10;
  RayK<8> *local_5f08;
  undefined1 local_5f00 [32];
  undefined1 local_5ee0 [40];
  undefined1 (*local_5eb8) [32];
  RTCFilterFunctionNArguments local_5eb0;
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [8];
  undefined1 auStack_5e58 [8];
  float fStack_5e50;
  float fStack_5e4c;
  float fStack_5e48;
  undefined1 local_5e40 [20];
  uint uStack_5e2c;
  uint uStack_5e28;
  uint uStack_5e24;
  ulong local_5e10;
  Scene *local_5e08;
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [8];
  float fStack_5d38;
  float fStack_5d34;
  float fStack_5d30;
  float fStack_5d2c;
  float fStack_5d28;
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  RTCHitN local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [16];
  undefined1 local_5bb0 [16];
  undefined1 local_5ba0 [16];
  undefined1 local_5b90 [16];
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b40;
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [8];
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar162 [64];
  undefined1 auVar191 [64];
  undefined1 auVar272 [36];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar151 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar152 = vpcmpeqd_avx(auVar151,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar151 = vpcmpeqd_avx(auVar151,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar129 = ZEXT816(0) << 0x40;
      auVar153 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar129),5);
      auVar171._16_16_ = auVar151;
      auVar171._0_16_ = auVar152;
      auVar130 = auVar171 & auVar153;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0x7f,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar130 >> 0xbf,0) != '\0') ||
          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar130[0x1f] < '\0') {
        local_5940 = vandps_avx(auVar153,auVar171);
        auVar234 = ZEXT3264(local_5940);
        local_5b40._0_8_ = *(undefined8 *)ray;
        local_5b40._8_8_ = *(undefined8 *)(ray + 8);
        local_5b40._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b40._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b40._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b40._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b40._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b40._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b40._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b40._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b40._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b40._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5aa0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        auVar246._8_4_ = 0x219392ef;
        auVar246._0_8_ = 0x219392ef219392ef;
        auVar246._12_4_ = 0x219392ef;
        auVar246._16_4_ = 0x219392ef;
        auVar246._20_4_ = 0x219392ef;
        auVar246._24_4_ = 0x219392ef;
        auVar246._28_4_ = 0x219392ef;
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = &DAT_3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        auVar219._16_4_ = 0x3f800000;
        auVar219._20_4_ = 0x3f800000;
        auVar219._24_4_ = 0x3f800000;
        auVar219._28_4_ = 0x3f800000;
        auVar153 = vandps_avx(auVar224,local_5ae0);
        auVar172 = vdivps_avx(auVar219,local_5ae0);
        auVar130 = vcmpps_avx(auVar153,auVar246,1);
        auVar173 = vdivps_avx(auVar219,local_5ac0);
        auVar153 = vandps_avx(auVar224,local_5ac0);
        auVar185 = vdivps_avx(auVar219,local_5aa0);
        auVar221 = ZEXT3264(auVar185);
        auVar171 = vcmpps_avx(auVar153,auVar246,1);
        auVar153 = vandps_avx(auVar224,local_5aa0);
        auVar225._8_4_ = 0x5d5e0b6b;
        auVar225._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar225._12_4_ = 0x5d5e0b6b;
        auVar225._16_4_ = 0x5d5e0b6b;
        auVar225._20_4_ = 0x5d5e0b6b;
        auVar225._24_4_ = 0x5d5e0b6b;
        auVar225._28_4_ = 0x5d5e0b6b;
        _local_5a80 = vblendvps_avx(auVar172,auVar225,auVar130);
        local_5a60 = vblendvps_avx(auVar173,auVar225,auVar171);
        auVar153 = vcmpps_avx(auVar153,auVar246,1);
        local_5a40 = vblendvps_avx(auVar185,auVar225,auVar153);
        auVar130._8_4_ = 0x20;
        auVar130._0_8_ = 0x2000000020;
        auVar130._12_4_ = 0x20;
        auVar130._16_4_ = 0x20;
        auVar130._20_4_ = 0x20;
        auVar130._24_4_ = 0x20;
        auVar130._28_4_ = 0x20;
        auVar153 = vcmpps_avx(_local_5a80,ZEXT1632(auVar129),1);
        local_5a20 = vandps_avx(auVar153,auVar130);
        auVar130 = ZEXT1632(auVar129);
        auVar153 = vcmpps_avx(local_5a60,auVar130,5);
        auVar172._8_4_ = 0x40;
        auVar172._0_8_ = 0x4000000040;
        auVar172._12_4_ = 0x40;
        auVar172._16_4_ = 0x40;
        auVar172._20_4_ = 0x40;
        auVar172._24_4_ = 0x40;
        auVar172._28_4_ = 0x40;
        auVar189._8_4_ = 0x60;
        auVar189._0_8_ = 0x6000000060;
        auVar189._12_4_ = 0x60;
        auVar189._16_4_ = 0x60;
        auVar189._20_4_ = 0x60;
        auVar189._24_4_ = 0x60;
        auVar189._28_4_ = 0x60;
        auVar191 = ZEXT3264(auVar189);
        local_5a00 = vblendvps_avx(auVar189,auVar172,auVar153);
        auVar153 = vcmpps_avx(local_5a40,auVar130,5);
        auVar173._8_4_ = 0x80;
        auVar173._0_8_ = 0x8000000080;
        auVar173._12_4_ = 0x80;
        auVar173._16_4_ = 0x80;
        auVar173._20_4_ = 0x80;
        auVar173._24_4_ = 0x80;
        auVar173._28_4_ = 0x80;
        auVar185._8_4_ = 0xa0;
        auVar185._0_8_ = 0xa0000000a0;
        auVar185._12_4_ = 0xa0;
        auVar185._16_4_ = 0xa0;
        auVar185._20_4_ = 0xa0;
        auVar185._24_4_ = 0xa0;
        auVar185._28_4_ = 0xa0;
        local_59e0 = vblendvps_avx(auVar185,auVar173,auVar153);
        auVar153 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar130);
        auVar130 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar130);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar248 = ZEXT3264(local_4680);
        local_59c0 = vblendvps_avx(local_4680,auVar153,local_5940);
        auVar153._8_4_ = 0xff800000;
        auVar153._0_8_ = 0xff800000ff800000;
        auVar153._12_4_ = 0xff800000;
        auVar153._16_4_ = 0xff800000;
        auVar153._20_4_ = 0xff800000;
        auVar153._24_4_ = 0xff800000;
        auVar153._28_4_ = 0xff800000;
        auVar162 = ZEXT3264(auVar153);
        local_59a0 = vblendvps_avx(auVar153,auVar130,local_5940);
        auVar153 = vcmpps_avx(in_ZMM15._0_32_,in_ZMM15._0_32_,0xf);
        auVar292 = ZEXT3264(auVar153);
        local_5e40._4_4_ = local_5940._4_4_ ^ auVar153._4_4_;
        local_5e40._0_4_ = local_5940._0_4_ ^ auVar153._0_4_;
        local_5e40._8_4_ = local_5940._8_4_ ^ auVar153._8_4_;
        local_5e40._12_4_ = local_5940._12_4_ ^ auVar153._12_4_;
        local_5e40._16_4_ = local_5940._16_4_ ^ auVar153._16_4_;
        uStack_5e2c = local_5940._20_4_ ^ auVar153._20_4_;
        uStack_5e28 = local_5940._24_4_ ^ auVar153._24_4_;
        uStack_5e24 = local_5940._28_4_ ^ auVar153._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar101 = 7;
        }
        else {
          uVar101 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f08 = ray + 0x100;
        puVar102 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar98 = (undefined1 (*) [32])local_4640;
        local_5808 = (bvh->root).ptr;
        local_5960._16_16_ = mm_lookupmask_ps._0_16_;
        local_5960._0_16_ = mm_lookupmask_ps._0_16_;
        local_4660 = local_59c0;
        local_5980 = mm_lookupmask_pd._0_8_;
        uStack_5978 = mm_lookupmask_pd._8_8_;
        uStack_5970 = mm_lookupmask_pd._0_8_;
        uStack_5968 = mm_lookupmask_pd._8_8_;
        local_5eb8 = (undefined1 (*) [32])&local_5b80;
LAB_004899f8:
        auVar151 = auVar162._0_16_;
        pauVar98 = pauVar98 + -1;
        root.ptr = puVar102[-1];
        puVar102 = puVar102 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_0048adb4;
        _local_5f40 = *pauVar98;
        auVar153 = vcmpps_avx(_local_5f40,local_59a0,1);
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0x7f,0) == '\0') &&
              (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar153 >> 0xbf,0) == '\0') &&
            (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar153[0x1f]) {
LAB_0048adc5:
          iVar97 = 2;
        }
        else {
          uVar106 = vmovmskps_avx(auVar153);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar106);
          iVar97 = 0;
          if ((uint)POPCOUNT(uVar106) <= uVar101) {
            while (unaff_R15 != 0) {
              k = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> k & 1) == 0; k = k + 1) {
                }
              }
              local_5f00._0_8_ = k;
              auVar162 = ZEXT1664(auVar162._0_16_);
              auVar191 = ZEXT1664(auVar191._0_16_);
              auVar221 = ZEXT1664(auVar221._0_16_);
              auVar234 = ZEXT1664(auVar234._0_16_);
              auVar153 = ZEXT1632(auVar292._0_16_);
              local_5f10 = ray;
              bVar107 = occluded1(This,bvh,root,k,&local_5f49,ray,
                                  (TravRayK<8,_true> *)&local_5b40.field_0,context);
              auVar151 = auVar162._0_16_;
              if (bVar107) {
                *(undefined4 *)(local_5e40 + local_5f00._0_8_ * 4) = 0xffffffff;
              }
              unaff_R15 = unaff_R15 & unaff_R15 - 1;
              auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar153 = vcmpps_avx(auVar153,auVar153,0xf);
              auVar292 = ZEXT3264(auVar153);
              ray = local_5f10;
            }
            auVar151 = vpcmpeqd_avx(auVar151,auVar151);
            auVar152 = vpcmpgtd_avx(stack0xffffffffffffa1d0,auVar151);
            auVar151 = vpcmpgtd_avx(local_5e40._0_16_,auVar151);
            auVar162 = ZEXT1664(auVar151);
            auVar151 = vpor_avx(auVar151,auVar152);
            iVar97 = 3;
            unaff_R15 = 0;
            if ((((auVar151 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar151 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar151 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar151[0xf] < '\0') {
              auVar161._8_4_ = 0xff800000;
              auVar161._0_8_ = 0xff800000ff800000;
              auVar161._12_4_ = 0xff800000;
              auVar161._16_4_ = 0xff800000;
              auVar161._20_4_ = 0xff800000;
              auVar161._24_4_ = 0xff800000;
              auVar161._28_4_ = 0xff800000;
              auVar162 = ZEXT3264(auVar161);
              local_59a0 = vblendvps_avx(local_59a0,auVar161,_local_5e40);
              iVar97 = 2;
            }
          }
          if (uVar101 < (uint)POPCOUNT(uVar106)) {
            do {
              if ((root.ptr & 8) != 0) {
                auVar151 = auVar162._0_16_;
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0048adb4;
                auVar153 = vcmpps_avx(local_59a0,_local_5f40,6);
                if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar153 >> 0x7f,0) == '\0') &&
                      (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar153 >> 0xbf,0) == '\0') &&
                    (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar153[0x1f]) goto LAB_0048adc5;
                local_5e10 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar123 = _local_5e40;
                if (local_5e10 == 0) goto LAB_0048ad60;
                auVar131._0_4_ = auVar292._0_4_ ^ local_5e40._0_4_;
                auVar131._4_4_ = auVar292._4_4_ ^ local_5e40._4_4_;
                auVar131._8_4_ = auVar292._8_4_ ^ local_5e40._8_4_;
                auVar131._12_4_ = auVar292._12_4_ ^ local_5e40._12_4_;
                auVar131._16_4_ = auVar292._16_4_ ^ local_5e40._16_4_;
                auVar131._20_4_ = auVar292._20_4_ ^ local_5e40._20_4_;
                auVar131._24_4_ = auVar292._24_4_ ^ local_5e40._24_4_;
                auVar131._28_4_ = auVar292._28_4_ ^ local_5e40._28_4_;
                lVar104 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar105 = 0;
                goto LAB_00489c3e;
              }
              auVar277 = ZEXT3264(auVar248._0_32_);
              uVar105 = 0;
              uVar103 = 8;
              do {
                uVar99 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar105 * 8);
                if (uVar99 != 8) {
                  uVar106 = *(undefined4 *)(root.ptr + 0x40 + uVar105 * 4);
                  auVar109._4_4_ = uVar106;
                  auVar109._0_4_ = uVar106;
                  auVar109._8_4_ = uVar106;
                  auVar109._12_4_ = uVar106;
                  auVar109._16_4_ = uVar106;
                  auVar109._20_4_ = uVar106;
                  auVar109._24_4_ = uVar106;
                  auVar109._28_4_ = uVar106;
                  auVar87._8_8_ = local_5b40._8_8_;
                  auVar87._0_8_ = local_5b40._0_8_;
                  auVar87._16_8_ = local_5b40._16_8_;
                  auVar87._24_8_ = local_5b40._24_8_;
                  auVar88._8_8_ = local_5b40._40_8_;
                  auVar88._0_8_ = local_5b40._32_8_;
                  auVar88._16_8_ = local_5b40._48_8_;
                  auVar88._24_8_ = local_5b40._56_8_;
                  auVar89._8_8_ = local_5b40._72_8_;
                  auVar89._0_8_ = local_5b40._64_8_;
                  auVar89._16_8_ = local_5b40._80_8_;
                  auVar89._24_8_ = local_5b40._88_8_;
                  auVar153 = vsubps_avx(auVar109,auVar87);
                  auVar192._0_4_ = (float)local_5a80._0_4_ * auVar153._0_4_;
                  auVar192._4_4_ = (float)local_5a80._4_4_ * auVar153._4_4_;
                  auVar192._8_4_ = fStack_5a78 * auVar153._8_4_;
                  auVar192._12_4_ = fStack_5a74 * auVar153._12_4_;
                  auVar192._16_4_ = fStack_5a70 * auVar153._16_4_;
                  auVar192._20_4_ = fStack_5a6c * auVar153._20_4_;
                  auVar192._28_36_ = auVar191._28_36_;
                  auVar192._24_4_ = fStack_5a68 * auVar153._24_4_;
                  auVar171 = auVar192._0_32_;
                  auVar191 = ZEXT3264(auVar171);
                  uVar106 = *(undefined4 *)(root.ptr + 0x80 + uVar105 * 4);
                  auVar110._4_4_ = uVar106;
                  auVar110._0_4_ = uVar106;
                  auVar110._8_4_ = uVar106;
                  auVar110._12_4_ = uVar106;
                  auVar110._16_4_ = uVar106;
                  auVar110._20_4_ = uVar106;
                  auVar110._24_4_ = uVar106;
                  auVar110._28_4_ = uVar106;
                  auVar153 = vsubps_avx(auVar110,auVar88);
                  auVar222._0_4_ = local_5a60._0_4_ * auVar153._0_4_;
                  auVar222._4_4_ = local_5a60._4_4_ * auVar153._4_4_;
                  auVar222._8_4_ = local_5a60._8_4_ * auVar153._8_4_;
                  auVar222._12_4_ = local_5a60._12_4_ * auVar153._12_4_;
                  auVar222._16_4_ = local_5a60._16_4_ * auVar153._16_4_;
                  auVar222._20_4_ = local_5a60._20_4_ * auVar153._20_4_;
                  auVar222._28_36_ = auVar221._28_36_;
                  auVar222._24_4_ = local_5a60._24_4_ * auVar153._24_4_;
                  auVar172 = auVar222._0_32_;
                  auVar221 = ZEXT3264(auVar172);
                  uVar106 = *(undefined4 *)(root.ptr + 0xc0 + uVar105 * 4);
                  auVar111._4_4_ = uVar106;
                  auVar111._0_4_ = uVar106;
                  auVar111._8_4_ = uVar106;
                  auVar111._12_4_ = uVar106;
                  auVar111._16_4_ = uVar106;
                  auVar111._20_4_ = uVar106;
                  auVar111._24_4_ = uVar106;
                  auVar111._28_4_ = uVar106;
                  auVar153 = vsubps_avx(auVar111,auVar89);
                  auVar235._0_4_ = local_5a40._0_4_ * auVar153._0_4_;
                  auVar235._4_4_ = local_5a40._4_4_ * auVar153._4_4_;
                  auVar235._8_4_ = local_5a40._8_4_ * auVar153._8_4_;
                  auVar235._12_4_ = local_5a40._12_4_ * auVar153._12_4_;
                  auVar235._16_4_ = local_5a40._16_4_ * auVar153._16_4_;
                  auVar235._20_4_ = local_5a40._20_4_ * auVar153._20_4_;
                  auVar235._28_36_ = auVar234._28_36_;
                  auVar235._24_4_ = local_5a40._24_4_ * auVar153._24_4_;
                  auVar173 = auVar235._0_32_;
                  auVar234 = ZEXT3264(auVar173);
                  uVar106 = *(undefined4 *)(root.ptr + 0x60 + uVar105 * 4);
                  auVar112._4_4_ = uVar106;
                  auVar112._0_4_ = uVar106;
                  auVar112._8_4_ = uVar106;
                  auVar112._12_4_ = uVar106;
                  auVar112._16_4_ = uVar106;
                  auVar112._20_4_ = uVar106;
                  auVar112._24_4_ = uVar106;
                  auVar112._28_4_ = uVar106;
                  auVar153 = vsubps_avx(auVar112,auVar87);
                  auVar13._4_4_ = (float)local_5a80._4_4_ * auVar153._4_4_;
                  auVar13._0_4_ = (float)local_5a80._0_4_ * auVar153._0_4_;
                  auVar13._8_4_ = fStack_5a78 * auVar153._8_4_;
                  auVar13._12_4_ = fStack_5a74 * auVar153._12_4_;
                  auVar13._16_4_ = fStack_5a70 * auVar153._16_4_;
                  auVar13._20_4_ = fStack_5a6c * auVar153._20_4_;
                  auVar13._24_4_ = fStack_5a68 * auVar153._24_4_;
                  auVar13._28_4_ = (int)((ulong)local_5b40._24_8_ >> 0x20);
                  uVar106 = *(undefined4 *)(root.ptr + 0xa0 + uVar105 * 4);
                  auVar113._4_4_ = uVar106;
                  auVar113._0_4_ = uVar106;
                  auVar113._8_4_ = uVar106;
                  auVar113._12_4_ = uVar106;
                  auVar113._16_4_ = uVar106;
                  auVar113._20_4_ = uVar106;
                  auVar113._24_4_ = uVar106;
                  auVar113._28_4_ = uVar106;
                  auVar153 = vsubps_avx(auVar113,auVar88);
                  auVar14._4_4_ = local_5a60._4_4_ * auVar153._4_4_;
                  auVar14._0_4_ = local_5a60._0_4_ * auVar153._0_4_;
                  auVar14._8_4_ = local_5a60._8_4_ * auVar153._8_4_;
                  auVar14._12_4_ = local_5a60._12_4_ * auVar153._12_4_;
                  auVar14._16_4_ = local_5a60._16_4_ * auVar153._16_4_;
                  auVar14._20_4_ = local_5a60._20_4_ * auVar153._20_4_;
                  auVar14._24_4_ = local_5a60._24_4_ * auVar153._24_4_;
                  auVar14._28_4_ = (int)((ulong)local_5b40._56_8_ >> 0x20);
                  uVar106 = *(undefined4 *)(root.ptr + 0xe0 + uVar105 * 4);
                  auVar114._4_4_ = uVar106;
                  auVar114._0_4_ = uVar106;
                  auVar114._8_4_ = uVar106;
                  auVar114._12_4_ = uVar106;
                  auVar114._16_4_ = uVar106;
                  auVar114._20_4_ = uVar106;
                  auVar114._24_4_ = uVar106;
                  auVar114._28_4_ = uVar106;
                  auVar153 = vsubps_avx(auVar114,auVar89);
                  auVar15._4_4_ = local_5a40._4_4_ * auVar153._4_4_;
                  auVar15._0_4_ = local_5a40._0_4_ * auVar153._0_4_;
                  auVar15._8_4_ = local_5a40._8_4_ * auVar153._8_4_;
                  auVar15._12_4_ = local_5a40._12_4_ * auVar153._12_4_;
                  auVar15._16_4_ = local_5a40._16_4_ * auVar153._16_4_;
                  auVar15._20_4_ = local_5a40._20_4_ * auVar153._20_4_;
                  auVar15._24_4_ = local_5a40._24_4_ * auVar153._24_4_;
                  auVar15._28_4_ = (int)((ulong)local_5b40._88_8_ >> 0x20);
                  auVar153 = vminps_avx(auVar171,auVar13);
                  auVar130 = vminps_avx(auVar172,auVar14);
                  auVar153 = vmaxps_avx(auVar153,auVar130);
                  auVar130 = vminps_avx(auVar173,auVar15);
                  auVar153 = vmaxps_avx(auVar153,auVar130);
                  auVar16._4_4_ = auVar153._4_4_ * 0.99999964;
                  auVar16._0_4_ = auVar153._0_4_ * 0.99999964;
                  auVar16._8_4_ = auVar153._8_4_ * 0.99999964;
                  auVar16._12_4_ = auVar153._12_4_ * 0.99999964;
                  auVar16._16_4_ = auVar153._16_4_ * 0.99999964;
                  auVar16._20_4_ = auVar153._20_4_ * 0.99999964;
                  auVar16._24_4_ = auVar153._24_4_ * 0.99999964;
                  auVar16._28_4_ = auVar153._28_4_;
                  auVar153 = vmaxps_avx(auVar171,auVar13);
                  auVar130 = vmaxps_avx(auVar172,auVar14);
                  auVar130 = vminps_avx(auVar153,auVar130);
                  auVar153 = vmaxps_avx(auVar173,auVar15);
                  auVar153 = vminps_avx(auVar130,auVar153);
                  auVar17._4_4_ = auVar153._4_4_ * 1.0000004;
                  auVar17._0_4_ = auVar153._0_4_ * 1.0000004;
                  auVar17._8_4_ = auVar153._8_4_ * 1.0000004;
                  auVar17._12_4_ = auVar153._12_4_ * 1.0000004;
                  auVar17._16_4_ = auVar153._16_4_ * 1.0000004;
                  auVar17._20_4_ = auVar153._20_4_ * 1.0000004;
                  auVar17._24_4_ = auVar153._24_4_ * 1.0000004;
                  auVar17._28_4_ = auVar153._28_4_;
                  auVar153 = vmaxps_avx(auVar16,local_59c0);
                  auVar162 = ZEXT3264(auVar153);
                  auVar130 = vminps_avx(auVar17,local_59a0);
                  auVar153 = vcmpps_avx(auVar153,auVar130,2);
                  if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar153 >> 0x7f,0) != '\0') ||
                        (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar153 >> 0xbf,0) != '\0') ||
                      (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar153[0x1f] < '\0') {
                    auVar153 = vblendvps_avx(auVar248._0_32_,auVar16,auVar153);
                    if (uVar103 != 8) {
                      *puVar102 = uVar103;
                      puVar102 = puVar102 + 1;
                      *pauVar98 = auVar277._0_32_;
                      pauVar98 = pauVar98 + 1;
                    }
                    auVar277 = ZEXT3264(auVar153);
                    uVar103 = uVar99;
                  }
                }
                _local_5f40 = auVar277._0_32_;
              } while ((uVar99 != 8) && (bVar107 = uVar105 < 7, uVar105 = uVar105 + 1, bVar107));
              iVar97 = 0;
              if (uVar103 == 8) {
LAB_00489be3:
                bVar107 = false;
                iVar97 = 4;
              }
              else {
                auVar153 = vcmpps_avx(local_59a0,_local_5f40,6);
                uVar106 = vmovmskps_avx(auVar153);
                bVar107 = true;
                if ((uint)POPCOUNT(uVar106) <= uVar101) {
                  *puVar102 = uVar103;
                  puVar102 = puVar102 + 1;
                  *pauVar98 = _local_5f40;
                  pauVar98 = pauVar98 + 1;
                  goto LAB_00489be3;
                }
              }
              root.ptr = uVar103;
            } while (bVar107);
          }
        }
        goto LAB_0048adb7;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar105 = uVar105 + 1;
    lVar104 = lVar104 + 0x60;
    if (local_5e10 <= uVar105) break;
LAB_00489c3e:
    local_5e08 = context->scene;
    uVar103 = 0;
    local_5f48 = uVar105;
    local_5f00 = auVar131;
    local_5e80 = auVar131;
    while (auVar153 = local_5960, uVar4 = *(uint *)(lVar104 + uVar103 * 4), unaff_R15 = uVar103,
          uVar4 != 0xffffffff) {
      uVar5 = *(uint *)(lVar104 + -0x10 + uVar103 * 4);
      pfVar6 = (local_5e08->vertices).items[uVar5];
      uVar99 = (ulong)*(uint *)(lVar104 + -0x50 + uVar103 * 4);
      fVar263 = pfVar6[uVar99];
      auVar273._4_4_ = fVar263;
      auVar273._0_4_ = fVar263;
      auVar273._8_4_ = fVar263;
      auVar273._12_4_ = fVar263;
      auVar273._16_4_ = fVar263;
      auVar273._20_4_ = fVar263;
      auVar273._24_4_ = fVar263;
      auVar273._28_4_ = fVar263;
      fVar2 = pfVar6[uVar99 + 1];
      auVar132._4_4_ = fVar2;
      auVar132._0_4_ = fVar2;
      auVar132._8_4_ = fVar2;
      auVar132._12_4_ = fVar2;
      auVar132._16_4_ = fVar2;
      auVar132._20_4_ = fVar2;
      auVar132._24_4_ = fVar2;
      auVar132._28_4_ = fVar2;
      fVar2 = pfVar6[uVar99 + 2];
      auVar154._4_4_ = fVar2;
      auVar154._0_4_ = fVar2;
      auVar154._8_4_ = fVar2;
      auVar154._12_4_ = fVar2;
      auVar154._16_4_ = fVar2;
      auVar154._20_4_ = fVar2;
      auVar154._24_4_ = fVar2;
      auVar154._28_4_ = fVar2;
      uVar99 = (ulong)*(uint *)(lVar104 + -0x20 + uVar103 * 4);
      fVar2 = pfVar6[uVar99];
      local_5da0._4_4_ = fVar2;
      local_5da0._0_4_ = fVar2;
      local_5da0._8_4_ = fVar2;
      local_5da0._12_4_ = fVar2;
      local_5da0._16_4_ = fVar2;
      local_5da0._20_4_ = fVar2;
      local_5da0._24_4_ = fVar2;
      local_5da0._28_4_ = fVar2;
      fVar2 = pfVar6[uVar99 + 1];
      local_5dc0._4_4_ = fVar2;
      local_5dc0._0_4_ = fVar2;
      local_5dc0._8_4_ = fVar2;
      local_5dc0._12_4_ = fVar2;
      local_5dc0._16_4_ = fVar2;
      local_5dc0._20_4_ = fVar2;
      local_5dc0._24_4_ = fVar2;
      local_5dc0._28_4_ = fVar2;
      fVar2 = pfVar6[uVar99 + 2];
      local_5de0._4_4_ = fVar2;
      local_5de0._0_4_ = fVar2;
      local_5de0._8_4_ = fVar2;
      local_5de0._12_4_ = fVar2;
      local_5de0._16_4_ = fVar2;
      local_5de0._20_4_ = fVar2;
      local_5de0._24_4_ = fVar2;
      local_5de0._28_4_ = fVar2;
      auVar130 = *(undefined1 (*) [32])(ray + 0x20);
      auVar171 = *(undefined1 (*) [32])(ray + 0x40);
      local_5ca0 = vsubps_avx(auVar132,auVar130);
      local_5cc0 = vsubps_avx(auVar154,auVar171);
      auVar173 = vsubps_avx(local_5dc0,auVar130);
      auVar185 = vsubps_avx(local_5de0,auVar171);
      local_5ce0 = vsubps_avx(auVar173,local_5ca0);
      local_5d00 = vsubps_avx(auVar185,local_5cc0);
      fVar262 = local_5ca0._0_4_;
      fVar210 = fVar262 + auVar173._0_4_;
      fVar266 = local_5ca0._4_4_;
      fVar213 = fVar266 + auVar173._4_4_;
      fVar267 = local_5ca0._8_4_;
      fVar214 = fVar267 + auVar173._8_4_;
      fVar268 = local_5ca0._12_4_;
      fVar215 = fVar268 + auVar173._12_4_;
      fVar269 = local_5ca0._16_4_;
      fVar216 = fVar269 + auVar173._16_4_;
      fVar270 = local_5ca0._20_4_;
      fVar217 = fVar270 + auVar173._20_4_;
      fVar271 = local_5ca0._24_4_;
      fVar218 = fVar271 + auVar173._24_4_;
      fVar2 = local_5cc0._0_4_;
      fVar233 = auVar185._0_4_ + fVar2;
      fVar10 = local_5cc0._4_4_;
      fVar236 = auVar185._4_4_ + fVar10;
      fVar11 = local_5cc0._8_4_;
      fVar237 = auVar185._8_4_ + fVar11;
      fVar142 = local_5cc0._12_4_;
      fVar238 = auVar185._12_4_ + fVar142;
      fVar146 = local_5cc0._16_4_;
      fVar239 = auVar185._16_4_ + fVar146;
      fVar149 = local_5cc0._20_4_;
      fVar240 = auVar185._20_4_ + fVar149;
      fVar12 = local_5cc0._24_4_;
      fVar241 = auVar185._24_4_ + fVar12;
      fVar209 = auVar185._28_4_;
      fVar243 = fVar209 + local_5cc0._28_4_;
      fVar108 = local_5d00._0_4_;
      fVar125 = local_5d00._4_4_;
      auVar18._4_4_ = fVar213 * fVar125;
      auVar18._0_4_ = fVar210 * fVar108;
      fVar128 = local_5d00._8_4_;
      auVar18._8_4_ = fVar214 * fVar128;
      fVar144 = local_5d00._12_4_;
      auVar18._12_4_ = fVar215 * fVar144;
      fVar195 = local_5d00._16_4_;
      auVar18._16_4_ = fVar216 * fVar195;
      fVar205 = local_5d00._20_4_;
      auVar18._20_4_ = fVar217 * fVar205;
      fVar252 = local_5d00._24_4_;
      auVar18._24_4_ = fVar218 * fVar252;
      auVar18._28_4_ = fVar209;
      fVar124 = local_5ce0._0_4_;
      auVar162._0_4_ = fVar233 * fVar124;
      fVar126 = local_5ce0._4_4_;
      auVar162._4_4_ = fVar236 * fVar126;
      fVar139 = local_5ce0._8_4_;
      auVar162._8_4_ = fVar237 * fVar139;
      fVar147 = local_5ce0._12_4_;
      auVar162._12_4_ = fVar238 * fVar147;
      fVar198 = local_5ce0._16_4_;
      auVar162._16_4_ = fVar239 * fVar198;
      fVar208 = local_5ce0._20_4_;
      auVar162._20_4_ = fVar240 * fVar208;
      fVar255 = local_5ce0._24_4_;
      auVar162._28_36_ = auVar248._28_36_;
      auVar162._24_4_ = fVar241 * fVar255;
      auVar189 = vsubps_avx(auVar162._0_32_,auVar18);
      auVar172 = *(undefined1 (*) [32])ray;
      local_5d20 = vsubps_avx(auVar273,auVar172);
      auVar219 = vsubps_avx(local_5da0,auVar172);
      _local_5d40 = vsubps_avx(auVar219,local_5d20);
      fVar223 = local_5d40._0_4_;
      fVar227 = local_5d40._4_4_;
      auVar19._4_4_ = fVar227 * fVar236;
      auVar19._0_4_ = fVar223 * fVar233;
      fVar228 = local_5d40._8_4_;
      auVar19._8_4_ = fVar228 * fVar237;
      fVar229 = local_5d40._12_4_;
      auVar19._12_4_ = fVar229 * fVar238;
      fVar230 = local_5d40._16_4_;
      auVar19._16_4_ = fVar230 * fVar239;
      fVar231 = local_5d40._20_4_;
      auVar19._20_4_ = fVar231 * fVar240;
      fVar232 = local_5d40._24_4_;
      auVar19._24_4_ = fVar232 * fVar241;
      auVar19._28_4_ = fVar243;
      fVar233 = local_5d20._0_4_;
      fVar244 = auVar219._0_4_ + fVar233;
      fVar236 = local_5d20._4_4_;
      fVar249 = auVar219._4_4_ + fVar236;
      fVar237 = local_5d20._8_4_;
      fVar251 = auVar219._8_4_ + fVar237;
      fVar238 = local_5d20._12_4_;
      fVar254 = auVar219._12_4_ + fVar238;
      fVar239 = local_5d20._16_4_;
      fVar257 = auVar219._16_4_ + fVar239;
      fVar240 = local_5d20._20_4_;
      fVar259 = auVar219._20_4_ + fVar240;
      fVar241 = local_5d20._24_4_;
      fVar261 = auVar219._24_4_ + fVar241;
      auVar20._4_4_ = fVar249 * fVar125;
      auVar20._0_4_ = fVar244 * fVar108;
      auVar20._8_4_ = fVar251 * fVar128;
      auVar20._12_4_ = fVar254 * fVar144;
      auVar20._16_4_ = fVar257 * fVar195;
      auVar20._20_4_ = fVar259 * fVar205;
      auVar20._24_4_ = fVar261 * fVar252;
      auVar20._28_4_ = fVar263;
      auVar224 = vsubps_avx(auVar20,auVar19);
      auVar21._4_4_ = fVar249 * fVar126;
      auVar21._0_4_ = fVar244 * fVar124;
      auVar21._8_4_ = fVar251 * fVar139;
      auVar21._12_4_ = fVar254 * fVar147;
      auVar21._16_4_ = fVar257 * fVar198;
      auVar21._20_4_ = fVar259 * fVar208;
      auVar21._24_4_ = fVar261 * fVar255;
      auVar21._28_4_ = fVar243;
      auVar22._4_4_ = fVar227 * fVar213;
      auVar22._0_4_ = fVar223 * fVar210;
      auVar22._8_4_ = fVar228 * fVar214;
      auVar22._12_4_ = fVar229 * fVar215;
      auVar22._16_4_ = fVar230 * fVar216;
      auVar22._20_4_ = fVar231 * fVar217;
      auVar22._24_4_ = fVar232 * fVar218;
      auVar22._28_4_ = local_5ca0._28_4_ + auVar173._28_4_;
      auVar225 = vsubps_avx(auVar22,auVar21);
      fVar261 = *(float *)(ray + 0xc0);
      fVar194 = *(float *)(ray + 0xc4);
      fVar197 = *(float *)(ray + 200);
      fVar200 = *(float *)(ray + 0xcc);
      fVar202 = *(float *)(ray + 0xd0);
      fVar204 = *(float *)(ray + 0xd4);
      fVar207 = *(float *)(ray + 0xd8);
      auVar95 = *(undefined1 (*) [28])(ray + 0xc0);
      pRVar1 = ray + 0xa0;
      auVar94 = *(undefined1 (*) [28])pRVar1;
      auVar123 = *(undefined1 (*) [32])pRVar1;
      uVar99 = (ulong)*(uint *)(lVar104 + -0x40 + uVar103 * 4);
      _local_5e60 = *(undefined1 (*) [32])(ray + 0x80);
      fVar210 = local_5e60._0_4_;
      fVar213 = local_5e60._4_4_;
      fVar215 = local_5e60._8_4_;
      fVar217 = local_5e60._12_4_;
      fVar244 = local_5e60._16_4_;
      fVar251 = local_5e60._20_4_;
      fVar257 = local_5e60._24_4_;
      fVar263 = pfVar6[uVar99 + 1];
      local_5e00._4_4_ = fVar263;
      local_5e00._0_4_ = fVar263;
      local_5e00._8_4_ = fVar263;
      local_5e00._12_4_ = fVar263;
      local_5e00._16_4_ = fVar263;
      local_5e00._20_4_ = fVar263;
      local_5e00._24_4_ = fVar263;
      local_5e00._28_4_ = fVar263;
      local_58e0._0_4_ =
           auVar189._0_4_ * fVar210 + auVar224._0_4_ * *(float *)pRVar1 + fVar261 * auVar225._0_4_;
      local_58e0._4_4_ =
           auVar189._4_4_ * fVar213 +
           auVar224._4_4_ * *(float *)(ray + 0xa4) + fVar194 * auVar225._4_4_;
      local_58e0._8_4_ =
           auVar189._8_4_ * fVar215 +
           auVar224._8_4_ * *(float *)(ray + 0xa8) + fVar197 * auVar225._8_4_;
      local_58e0._12_4_ =
           auVar189._12_4_ * fVar217 +
           auVar224._12_4_ * *(float *)(ray + 0xac) + fVar200 * auVar225._12_4_;
      local_58e0._16_4_ =
           auVar189._16_4_ * fVar244 +
           auVar224._16_4_ * *(float *)(ray + 0xb0) + fVar202 * auVar225._16_4_;
      local_58e0._20_4_ =
           auVar189._20_4_ * fVar251 +
           auVar224._20_4_ * *(float *)(ray + 0xb4) + fVar204 * auVar225._20_4_;
      local_58e0._24_4_ =
           auVar189._24_4_ * fVar257 +
           auVar224._24_4_ * *(float *)(ray + 0xb8) + fVar207 * auVar225._24_4_;
      local_58e0._28_4_ = auVar189._28_4_ + auVar224._28_4_ + auVar225._28_4_;
      auVar130 = vsubps_avx(local_5e00,auVar130);
      fVar263 = pfVar6[uVar99 + 2];
      local_5840._4_4_ = fVar263;
      local_5840._0_4_ = fVar263;
      local_5840._8_4_ = fVar263;
      local_5840._12_4_ = fVar263;
      local_5840._16_4_ = fVar263;
      local_5840._20_4_ = fVar263;
      local_5840._24_4_ = fVar263;
      local_5840._28_4_ = fVar263;
      auVar171 = vsubps_avx(local_5840,auVar171);
      local_5d60 = vsubps_avx(local_5ca0,auVar130);
      local_5d80 = vsubps_avx(local_5cc0,auVar171);
      fVar214 = fVar262 + auVar130._0_4_;
      fVar216 = fVar266 + auVar130._4_4_;
      fVar218 = fVar267 + auVar130._8_4_;
      fVar249 = fVar268 + auVar130._12_4_;
      fVar254 = fVar269 + auVar130._16_4_;
      fVar259 = fVar270 + auVar130._20_4_;
      fVar127 = fVar271 + auVar130._24_4_;
      fVar169 = fVar2 + auVar171._0_4_;
      fVar178 = fVar10 + auVar171._4_4_;
      fVar180 = fVar11 + auVar171._8_4_;
      fVar181 = fVar142 + auVar171._12_4_;
      fVar182 = fVar146 + auVar171._16_4_;
      fVar183 = fVar149 + auVar171._20_4_;
      fVar184 = fVar12 + auVar171._24_4_;
      fVar242 = local_5d80._0_4_;
      fVar245 = local_5d80._4_4_;
      auVar23._4_4_ = fVar245 * fVar216;
      auVar23._0_4_ = fVar242 * fVar214;
      fVar250 = local_5d80._8_4_;
      auVar23._8_4_ = fVar250 * fVar218;
      fVar253 = local_5d80._12_4_;
      auVar23._12_4_ = fVar253 * fVar249;
      fVar256 = local_5d80._16_4_;
      auVar23._16_4_ = fVar256 * fVar254;
      fVar258 = local_5d80._20_4_;
      auVar23._20_4_ = fVar258 * fVar259;
      fVar260 = local_5d80._24_4_;
      auVar23._24_4_ = fVar260 * fVar127;
      auVar23._28_4_ = local_5d40._28_4_;
      fVar274 = local_5d60._0_4_;
      fVar275 = local_5d60._4_4_;
      auVar24._4_4_ = fVar275 * fVar178;
      auVar24._0_4_ = fVar274 * fVar169;
      fVar276 = local_5d60._8_4_;
      auVar24._8_4_ = fVar276 * fVar180;
      fVar278 = local_5d60._12_4_;
      auVar24._12_4_ = fVar278 * fVar181;
      fVar279 = local_5d60._16_4_;
      auVar24._16_4_ = fVar279 * fVar182;
      fVar280 = local_5d60._20_4_;
      auVar24._20_4_ = fVar280 * fVar183;
      fVar281 = local_5d60._24_4_;
      auVar24._24_4_ = fVar281 * fVar184;
      auVar24._28_4_ = fVar243;
      auVar189 = vsubps_avx(auVar24,auVar23);
      fVar263 = pfVar6[uVar99];
      local_5860._4_4_ = fVar263;
      local_5860._0_4_ = fVar263;
      local_5860._8_4_ = fVar263;
      local_5860._12_4_ = fVar263;
      local_5860._16_4_ = fVar263;
      local_5860._20_4_ = fVar263;
      local_5860._24_4_ = fVar263;
      local_5860._28_4_ = fVar263;
      auVar172 = vsubps_avx(local_5860,auVar172);
      auVar234 = ZEXT3264(auVar172);
      auVar224 = vsubps_avx(local_5d20,auVar172);
      fVar282 = auVar224._0_4_;
      fVar283 = auVar224._4_4_;
      auVar25._4_4_ = fVar283 * fVar178;
      auVar25._0_4_ = fVar282 * fVar169;
      fVar284 = auVar224._8_4_;
      auVar25._8_4_ = fVar284 * fVar180;
      fVar285 = auVar224._12_4_;
      auVar25._12_4_ = fVar285 * fVar181;
      fVar286 = auVar224._16_4_;
      auVar25._16_4_ = fVar286 * fVar182;
      fVar287 = auVar224._20_4_;
      auVar25._20_4_ = fVar287 * fVar183;
      fVar288 = auVar224._24_4_;
      auVar25._24_4_ = fVar288 * fVar184;
      auVar25._28_4_ = local_5cc0._28_4_ + auVar171._28_4_;
      fVar263 = auVar172._0_4_ + fVar233;
      fVar169 = auVar172._4_4_ + fVar236;
      fVar178 = auVar172._8_4_ + fVar237;
      fVar180 = auVar172._12_4_ + fVar238;
      fVar181 = auVar172._16_4_ + fVar239;
      fVar182 = auVar172._20_4_ + fVar240;
      fVar183 = auVar172._24_4_ + fVar241;
      auVar26._4_4_ = fVar169 * fVar245;
      auVar26._0_4_ = fVar263 * fVar242;
      auVar26._8_4_ = fVar178 * fVar250;
      auVar26._12_4_ = fVar180 * fVar253;
      auVar26._16_4_ = fVar181 * fVar256;
      auVar26._20_4_ = fVar182 * fVar258;
      uVar106 = local_5d80._28_4_;
      auVar26._24_4_ = fVar183 * fVar260;
      auVar26._28_4_ = uVar106;
      auVar225 = vsubps_avx(auVar26,auVar25);
      auVar27._4_4_ = fVar169 * fVar275;
      auVar27._0_4_ = fVar263 * fVar274;
      auVar27._8_4_ = fVar178 * fVar276;
      auVar27._12_4_ = fVar180 * fVar278;
      auVar27._16_4_ = fVar181 * fVar279;
      auVar27._20_4_ = fVar182 * fVar280;
      auVar27._24_4_ = fVar183 * fVar281;
      auVar27._28_4_ = uVar106;
      auVar28._4_4_ = fVar283 * fVar216;
      auVar28._0_4_ = fVar282 * fVar214;
      auVar28._8_4_ = fVar284 * fVar218;
      auVar28._12_4_ = fVar285 * fVar249;
      auVar28._16_4_ = fVar286 * fVar254;
      auVar28._20_4_ = fVar287 * fVar259;
      auVar28._24_4_ = fVar288 * fVar127;
      auVar28._28_4_ = local_5ca0._28_4_ + auVar130._28_4_;
      auVar246 = vsubps_avx(auVar28,auVar27);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      local_5c80._0_4_ = auVar94._0_4_;
      local_5c80._4_4_ = auVar94._4_4_;
      fStack_5c78 = auVar94._8_4_;
      fStack_5c74 = auVar94._12_4_;
      fStack_5c70 = auVar94._16_4_;
      fStack_5c6c = auVar94._20_4_;
      fStack_5c68 = auVar94._24_4_;
      auVar264._0_4_ =
           auVar189._0_4_ * fVar210 +
           fVar261 * auVar246._0_4_ + (float)local_5c80._0_4_ * auVar225._0_4_;
      auVar264._4_4_ =
           auVar189._4_4_ * fVar213 +
           fVar194 * auVar246._4_4_ + (float)local_5c80._4_4_ * auVar225._4_4_;
      auVar264._8_4_ =
           auVar189._8_4_ * fVar215 + fVar197 * auVar246._8_4_ + fStack_5c78 * auVar225._8_4_;
      auVar264._12_4_ =
           auVar189._12_4_ * fVar217 + fVar200 * auVar246._12_4_ + fStack_5c74 * auVar225._12_4_;
      auVar264._16_4_ =
           auVar189._16_4_ * fVar244 + fVar202 * auVar246._16_4_ + fStack_5c70 * auVar225._16_4_;
      auVar264._20_4_ =
           auVar189._20_4_ * fVar251 + fVar204 * auVar246._20_4_ + fStack_5c6c * auVar225._20_4_;
      auVar264._24_4_ =
           auVar189._24_4_ * fVar257 + fVar207 * auVar246._24_4_ + fStack_5c68 * auVar225._24_4_;
      auVar264._28_4_ = auVar225._28_4_ + auVar246._28_4_ + auVar225._28_4_;
      auVar272 = ZEXT436((uint)auVar264._28_4_);
      auVar225 = vsubps_avx(auVar172,auVar219);
      fVar188 = auVar172._0_4_ + auVar219._0_4_;
      fVar193 = auVar172._4_4_ + auVar219._4_4_;
      fVar196 = auVar172._8_4_ + auVar219._8_4_;
      fVar199 = auVar172._12_4_ + auVar219._12_4_;
      fVar201 = auVar172._16_4_ + auVar219._16_4_;
      fVar203 = auVar172._20_4_ + auVar219._20_4_;
      fVar206 = auVar172._24_4_ + auVar219._24_4_;
      auVar246 = vsubps_avx(auVar130,auVar173);
      fVar184 = auVar130._0_4_ + auVar173._0_4_;
      fVar243 = auVar130._4_4_ + auVar173._4_4_;
      fVar140 = auVar130._8_4_ + auVar173._8_4_;
      fVar141 = auVar130._12_4_ + auVar173._12_4_;
      fVar143 = auVar130._16_4_ + auVar173._16_4_;
      fVar145 = auVar130._20_4_ + auVar173._20_4_;
      fVar148 = auVar130._24_4_ + auVar173._24_4_;
      auVar161 = vsubps_avx(auVar171,auVar185);
      fVar150 = auVar171._0_4_ + auVar185._0_4_;
      fVar163 = auVar171._4_4_ + auVar185._4_4_;
      fVar164 = auVar171._8_4_ + auVar185._8_4_;
      fVar165 = auVar171._12_4_ + auVar185._12_4_;
      fVar166 = auVar171._16_4_ + auVar185._16_4_;
      fVar167 = auVar171._20_4_ + auVar185._20_4_;
      fVar168 = auVar171._24_4_ + auVar185._24_4_;
      fVar263 = auVar161._0_4_;
      fVar214 = auVar161._4_4_;
      auVar29._4_4_ = fVar243 * fVar214;
      auVar29._0_4_ = fVar184 * fVar263;
      fVar216 = auVar161._8_4_;
      auVar29._8_4_ = fVar140 * fVar216;
      fVar218 = auVar161._12_4_;
      auVar29._12_4_ = fVar141 * fVar218;
      fVar249 = auVar161._16_4_;
      auVar29._16_4_ = fVar143 * fVar249;
      fVar254 = auVar161._20_4_;
      auVar29._20_4_ = fVar145 * fVar254;
      fVar259 = auVar161._24_4_;
      auVar29._24_4_ = fVar148 * fVar259;
      auVar29._28_4_ = fVar209;
      fVar127 = auVar246._0_4_;
      fVar169 = auVar246._4_4_;
      auVar30._4_4_ = fVar169 * fVar163;
      auVar30._0_4_ = fVar127 * fVar150;
      fVar178 = auVar246._8_4_;
      auVar30._8_4_ = fVar178 * fVar164;
      fVar180 = auVar246._12_4_;
      auVar30._12_4_ = fVar180 * fVar165;
      fVar181 = auVar246._16_4_;
      auVar30._16_4_ = fVar181 * fVar166;
      fVar182 = auVar246._20_4_;
      auVar30._20_4_ = fVar182 * fVar167;
      fVar183 = auVar246._24_4_;
      auVar30._24_4_ = fVar183 * fVar168;
      auVar30._28_4_ = auVar189._28_4_;
      auVar185 = vsubps_avx(auVar30,auVar29);
      fVar170 = auVar225._0_4_;
      fVar179 = auVar225._4_4_;
      auVar31._4_4_ = fVar179 * fVar163;
      auVar31._0_4_ = fVar170 * fVar150;
      fVar150 = auVar225._8_4_;
      auVar31._8_4_ = fVar150 * fVar164;
      fVar163 = auVar225._12_4_;
      auVar31._12_4_ = fVar163 * fVar165;
      fVar164 = auVar225._16_4_;
      auVar31._16_4_ = fVar164 * fVar166;
      fVar165 = auVar225._20_4_;
      auVar31._20_4_ = fVar165 * fVar167;
      fVar166 = auVar225._24_4_;
      auVar31._24_4_ = fVar166 * fVar168;
      auVar31._28_4_ = auVar171._28_4_ + fVar209;
      auVar32._4_4_ = fVar193 * fVar214;
      auVar32._0_4_ = fVar188 * fVar263;
      auVar32._8_4_ = fVar196 * fVar216;
      auVar32._12_4_ = fVar199 * fVar218;
      auVar32._16_4_ = fVar201 * fVar249;
      auVar32._20_4_ = fVar203 * fVar254;
      auVar32._24_4_ = fVar206 * fVar259;
      auVar32._28_4_ = auVar189._28_4_;
      auVar171 = vsubps_avx(auVar32,auVar31);
      auVar33._4_4_ = fVar193 * fVar169;
      auVar33._0_4_ = fVar188 * fVar127;
      auVar33._8_4_ = fVar196 * fVar178;
      auVar33._12_4_ = fVar199 * fVar180;
      auVar33._16_4_ = fVar201 * fVar181;
      auVar33._20_4_ = fVar203 * fVar182;
      auVar33._24_4_ = fVar206 * fVar183;
      auVar33._28_4_ = auVar172._28_4_ + auVar219._28_4_;
      auVar34._4_4_ = fVar179 * fVar243;
      auVar34._0_4_ = fVar170 * fVar184;
      auVar34._8_4_ = fVar150 * fVar140;
      auVar34._12_4_ = fVar163 * fVar141;
      auVar34._16_4_ = fVar164 * fVar143;
      auVar34._20_4_ = fVar165 * fVar145;
      auVar34._24_4_ = fVar166 * fVar148;
      auVar34._28_4_ = auVar130._28_4_ + auVar173._28_4_;
      auVar130 = vsubps_avx(auVar34,auVar33);
      auVar133._0_4_ =
           fVar210 * auVar185._0_4_ +
           fVar261 * auVar130._0_4_ + (float)local_5c80._0_4_ * auVar171._0_4_;
      auVar133._4_4_ =
           fVar213 * auVar185._4_4_ +
           fVar194 * auVar130._4_4_ + (float)local_5c80._4_4_ * auVar171._4_4_;
      auVar133._8_4_ =
           fVar215 * auVar185._8_4_ + fVar197 * auVar130._8_4_ + fStack_5c78 * auVar171._8_4_;
      auVar133._12_4_ =
           fVar217 * auVar185._12_4_ + fVar200 * auVar130._12_4_ + fStack_5c74 * auVar171._12_4_;
      auVar133._16_4_ =
           fVar244 * auVar185._16_4_ + fVar202 * auVar130._16_4_ + fStack_5c70 * auVar171._16_4_;
      auVar133._20_4_ =
           fVar251 * auVar185._20_4_ + fVar204 * auVar130._20_4_ + fStack_5c6c * auVar171._20_4_;
      auVar133._24_4_ =
           fVar257 * auVar185._24_4_ + fVar207 * auVar130._24_4_ + fStack_5c68 * auVar171._24_4_;
      auVar133._28_4_ = auVar171._28_4_ + auVar130._28_4_ + auVar171._28_4_;
      auVar226._0_4_ = auVar133._0_4_ + local_58e0._0_4_ + auVar264._0_4_;
      auVar226._4_4_ = auVar133._4_4_ + local_58e0._4_4_ + auVar264._4_4_;
      auVar226._8_4_ = auVar133._8_4_ + local_58e0._8_4_ + auVar264._8_4_;
      auVar226._12_4_ = auVar133._12_4_ + local_58e0._12_4_ + auVar264._12_4_;
      auVar226._16_4_ = auVar133._16_4_ + local_58e0._16_4_ + auVar264._16_4_;
      auVar226._20_4_ = auVar133._20_4_ + local_58e0._20_4_ + auVar264._20_4_;
      auVar226._24_4_ = auVar133._24_4_ + local_58e0._24_4_ + auVar264._24_4_;
      auVar226._28_4_ = auVar133._28_4_ + local_58e0._28_4_ + auVar264._28_4_;
      auVar130 = vminps_avx(local_58e0,auVar264);
      auVar130 = vminps_avx(auVar130,auVar133);
      local_5900 = vandps_avx(auVar226,auVar247);
      fVar261 = local_5900._0_4_ * 1.1920929e-07;
      fVar194 = local_5900._4_4_ * 1.1920929e-07;
      auVar35._4_4_ = fVar194;
      auVar35._0_4_ = fVar261;
      fVar197 = local_5900._8_4_ * 1.1920929e-07;
      auVar35._8_4_ = fVar197;
      fVar200 = local_5900._12_4_ * 1.1920929e-07;
      auVar35._12_4_ = fVar200;
      fVar202 = local_5900._16_4_ * 1.1920929e-07;
      auVar35._16_4_ = fVar202;
      fVar204 = local_5900._20_4_ * 1.1920929e-07;
      auVar35._20_4_ = fVar204;
      fVar207 = local_5900._24_4_ * 1.1920929e-07;
      auVar35._24_4_ = fVar207;
      auVar35._28_4_ = 0x34000000;
      auVar191 = ZEXT3264(auVar35);
      auVar220._0_8_ = CONCAT44(fVar194,fVar261) ^ 0x8000000080000000;
      auVar220._8_4_ = -fVar197;
      auVar220._12_4_ = -fVar200;
      auVar220._16_4_ = -fVar202;
      auVar220._20_4_ = -fVar204;
      auVar220._24_4_ = -fVar207;
      auVar220._28_4_ = 0xb4000000;
      auVar130 = vcmpps_avx(auVar130,auVar220,5);
      auVar171 = vmaxps_avx(local_58e0,auVar264);
      auVar171 = vmaxps_avx(auVar171,auVar133);
      auVar171 = vcmpps_avx(auVar171,auVar35,2);
      auVar171 = vorps_avx(auVar130,auVar171);
      auVar221 = ZEXT3264(auVar171);
      uVar99 = (ulong)*(uint *)(lVar104 + -0x30 + uVar103 * 4);
      auVar172 = local_5f00 & auVar171;
      local_5880 = pfVar6[uVar99];
      local_58a0 = pfVar6[uVar99 + 1];
      local_58c0 = pfVar6[uVar99 + 2];
      _local_5c80 = auVar123;
      fStack_58bc = local_58c0;
      fStack_58b8 = local_58c0;
      fStack_58b4 = local_58c0;
      fStack_58b0 = local_58c0;
      fStack_58ac = local_58c0;
      fStack_58a8 = local_58c0;
      fStack_58a4 = local_58c0;
      fStack_589c = local_58a0;
      fStack_5898 = local_58a0;
      fStack_5894 = local_58a0;
      fStack_5890 = local_58a0;
      fStack_588c = local_58a0;
      fStack_5888 = local_58a0;
      fStack_5884 = local_58a0;
      fStack_587c = local_5880;
      fStack_5878 = local_5880;
      fStack_5874 = local_5880;
      fStack_5870 = local_5880;
      fStack_586c = local_5880;
      fStack_5868 = local_5880;
      fStack_5864 = local_5880;
      if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0x7f,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar172 >> 0xbf,0) == '\0') &&
          (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar172[0x1f]) {
        auVar153 = vcmpps_avx(auVar224,auVar224,0xf);
        auVar292 = ZEXT3264(auVar153);
LAB_0048a907:
        auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar36._4_4_ = fVar275 * fVar125;
        auVar36._0_4_ = fVar274 * fVar108;
        auVar36._8_4_ = fVar276 * fVar128;
        auVar36._12_4_ = fVar278 * fVar144;
        auVar36._16_4_ = fVar279 * fVar195;
        auVar36._20_4_ = fVar280 * fVar205;
        auVar36._24_4_ = fVar281 * fVar252;
        auVar36._28_4_ = local_58c0;
        auVar37._4_4_ = fVar126 * fVar245;
        auVar37._0_4_ = fVar124 * fVar242;
        auVar37._8_4_ = fVar139 * fVar250;
        auVar37._12_4_ = fVar147 * fVar253;
        auVar37._16_4_ = fVar198 * fVar256;
        auVar37._20_4_ = fVar208 * fVar258;
        auVar37._24_4_ = fVar255 * fVar260;
        auVar37._28_4_ = auVar130._28_4_;
        auVar185 = vsubps_avx(auVar37,auVar36);
        auVar38._4_4_ = fVar169 * fVar245;
        auVar38._0_4_ = fVar127 * fVar242;
        auVar38._8_4_ = fVar178 * fVar250;
        auVar38._12_4_ = fVar180 * fVar253;
        auVar38._16_4_ = fVar181 * fVar256;
        auVar38._20_4_ = fVar182 * fVar258;
        auVar38._24_4_ = fVar183 * fVar260;
        auVar38._28_4_ = 0x34000000;
        auVar39._4_4_ = fVar275 * fVar214;
        auVar39._0_4_ = fVar274 * fVar263;
        auVar39._8_4_ = fVar276 * fVar216;
        auVar39._12_4_ = fVar278 * fVar218;
        auVar39._16_4_ = fVar279 * fVar249;
        auVar39._20_4_ = fVar280 * fVar254;
        auVar39._24_4_ = fVar281 * fVar259;
        auVar39._28_4_ = auVar226._28_4_;
        auVar173 = vsubps_avx(auVar39,auVar38);
        auVar130 = vandps_avx(auVar247,auVar36);
        auVar172 = vandps_avx(auVar247,auVar38);
        auVar130 = vcmpps_avx(auVar130,auVar172,1);
        auVar173 = vblendvps_avx(auVar173,auVar185,auVar130);
        auVar40._4_4_ = fVar283 * fVar214;
        auVar40._0_4_ = fVar282 * fVar263;
        auVar40._8_4_ = fVar284 * fVar216;
        auVar40._12_4_ = fVar285 * fVar218;
        auVar40._16_4_ = fVar286 * fVar249;
        auVar40._20_4_ = fVar287 * fVar254;
        auVar40._24_4_ = fVar288 * fVar259;
        auVar40._28_4_ = auVar130._28_4_;
        auVar41._4_4_ = fVar283 * fVar125;
        auVar41._0_4_ = fVar282 * fVar108;
        auVar41._8_4_ = fVar284 * fVar128;
        auVar41._12_4_ = fVar285 * fVar144;
        auVar41._16_4_ = fVar286 * fVar195;
        auVar41._20_4_ = fVar287 * fVar205;
        auVar41._24_4_ = fVar288 * fVar252;
        auVar41._28_4_ = auVar185._28_4_;
        auVar234 = ZEXT3264(auVar173);
        auVar42._4_4_ = fVar227 * fVar245;
        auVar42._0_4_ = fVar223 * fVar242;
        auVar42._8_4_ = fVar228 * fVar250;
        auVar42._12_4_ = fVar229 * fVar253;
        auVar42._16_4_ = fVar230 * fVar256;
        auVar42._20_4_ = fVar231 * fVar258;
        auVar42._24_4_ = fVar232 * fVar260;
        auVar42._28_4_ = auVar173._28_4_;
        auVar189 = vsubps_avx(auVar41,auVar42);
        auVar43._4_4_ = fVar179 * fVar245;
        auVar43._0_4_ = fVar170 * fVar242;
        auVar43._8_4_ = fVar150 * fVar250;
        auVar43._12_4_ = fVar163 * fVar253;
        auVar43._16_4_ = fVar164 * fVar256;
        auVar43._20_4_ = fVar165 * fVar258;
        auVar43._24_4_ = fVar166 * fVar260;
        auVar43._28_4_ = uVar106;
        auVar185 = vsubps_avx(auVar43,auVar40);
        auVar130 = vandps_avx(auVar247,auVar42);
        auVar172 = vandps_avx(auVar247,auVar40);
        auVar130 = vcmpps_avx(auVar130,auVar172,1);
        auVar185 = vblendvps_avx(auVar185,auVar189,auVar130);
        auVar44._4_4_ = fVar275 * fVar179;
        auVar44._0_4_ = fVar274 * fVar170;
        auVar44._8_4_ = fVar276 * fVar150;
        auVar44._12_4_ = fVar278 * fVar163;
        auVar44._16_4_ = fVar279 * fVar164;
        auVar44._20_4_ = fVar280 * fVar165;
        auVar44._24_4_ = fVar281 * fVar166;
        auVar44._28_4_ = auVar130._28_4_;
        auVar45._4_4_ = fVar275 * fVar227;
        auVar45._0_4_ = fVar274 * fVar223;
        auVar45._8_4_ = fVar276 * fVar228;
        auVar45._12_4_ = fVar278 * fVar229;
        auVar45._16_4_ = fVar279 * fVar230;
        auVar45._20_4_ = fVar280 * fVar231;
        auVar45._24_4_ = fVar281 * fVar232;
        auVar45._28_4_ = auVar189._28_4_;
        auVar46._4_4_ = fVar283 * fVar126;
        auVar46._0_4_ = fVar282 * fVar124;
        auVar46._8_4_ = fVar284 * fVar139;
        auVar46._12_4_ = fVar285 * fVar147;
        auVar46._16_4_ = fVar286 * fVar198;
        auVar46._20_4_ = fVar287 * fVar208;
        auVar46._24_4_ = fVar288 * fVar255;
        auVar46._28_4_ = auVar225._28_4_;
        auVar47._4_4_ = fVar283 * fVar169;
        auVar47._0_4_ = fVar282 * fVar127;
        auVar47._8_4_ = fVar284 * fVar178;
        auVar47._12_4_ = fVar285 * fVar180;
        auVar47._16_4_ = fVar286 * fVar181;
        auVar47._20_4_ = fVar287 * fVar182;
        auVar47._24_4_ = fVar288 * fVar183;
        auVar47._28_4_ = auVar246._28_4_;
        auVar219 = vsubps_avx(auVar45,auVar46);
        auVar225 = vsubps_avx(auVar47,auVar44);
        auVar130 = vandps_avx(auVar247,auVar46);
        auVar172 = vandps_avx(auVar247,auVar44);
        auVar189 = vcmpps_avx(auVar130,auVar172,1);
        auVar172 = vblendvps_avx(auVar225,auVar219,auVar189);
        auVar191 = ZEXT3264(auVar172);
        local_5f40._0_4_ = auVar95._0_4_;
        local_5f40._4_4_ = auVar95._4_4_;
        fStack_5f38 = auVar95._8_4_;
        fStack_5f34 = auVar95._12_4_;
        fStack_5f30 = auVar95._16_4_;
        fStack_5f2c = auVar95._20_4_;
        fStack_5f28 = auVar95._24_4_;
        fVar263 = auVar189._28_4_;
        fVar108 = auVar173._0_4_ * fVar210 +
                  auVar172._0_4_ * (float)local_5f40._0_4_ +
                  (float)local_5c80._0_4_ * auVar185._0_4_;
        fVar124 = auVar173._4_4_ * fVar213 +
                  auVar172._4_4_ * (float)local_5f40._4_4_ +
                  (float)local_5c80._4_4_ * auVar185._4_4_;
        fVar210 = auVar173._8_4_ * fVar215 +
                  auVar172._8_4_ * fStack_5f38 + fStack_5c78 * auVar185._8_4_;
        fVar125 = auVar173._12_4_ * fVar217 +
                  auVar172._12_4_ * fStack_5f34 + fStack_5c74 * auVar185._12_4_;
        fVar126 = auVar173._16_4_ * fVar244 +
                  auVar172._16_4_ * fStack_5f30 + fStack_5c70 * auVar185._16_4_;
        fVar213 = auVar173._20_4_ * fVar251 +
                  auVar172._20_4_ * fStack_5f2c + fStack_5c6c * auVar185._20_4_;
        fVar214 = auVar173._24_4_ * fVar257 +
                  auVar172._24_4_ * fStack_5f28 + fStack_5c68 * auVar185._24_4_;
        fVar128 = fVar263 + auVar225._28_4_ + fVar263;
        auVar115._0_4_ = fVar108 + fVar108;
        auVar115._4_4_ = fVar124 + fVar124;
        auVar115._8_4_ = fVar210 + fVar210;
        auVar115._12_4_ = fVar125 + fVar125;
        auVar115._16_4_ = fVar126 + fVar126;
        auVar115._20_4_ = fVar213 + fVar213;
        auVar115._24_4_ = fVar214 + fVar214;
        auVar115._28_4_ = fVar128 + fVar128;
        fVar108 = auVar173._0_4_ * fVar233 + auVar172._0_4_ * fVar2 + auVar185._0_4_ * fVar262;
        fVar124 = auVar173._4_4_ * fVar236 + auVar172._4_4_ * fVar10 + auVar185._4_4_ * fVar266;
        fVar210 = auVar173._8_4_ * fVar237 + auVar172._8_4_ * fVar11 + auVar185._8_4_ * fVar267;
        fVar142 = auVar173._12_4_ * fVar238 + auVar172._12_4_ * fVar142 + auVar185._12_4_ * fVar268;
        fVar238 = auVar173._16_4_ * fVar239 + auVar172._16_4_ * fVar146 + auVar185._16_4_ * fVar269;
        fVar146 = auVar173._20_4_ * fVar240 + auVar172._20_4_ * fVar149 + auVar185._20_4_ * fVar270;
        fVar239 = auVar173._24_4_ * fVar241 + auVar172._24_4_ * fVar12 + auVar185._24_4_ * fVar271;
        fVar149 = auVar219._28_4_ + fVar263 + auVar219._28_4_;
        auVar189 = vrcpps_avx(auVar115);
        fVar263 = auVar189._0_4_;
        fVar2 = auVar189._4_4_;
        auVar48._4_4_ = auVar115._4_4_ * fVar2;
        auVar48._0_4_ = auVar115._0_4_ * fVar263;
        fVar233 = auVar189._8_4_;
        auVar48._8_4_ = auVar115._8_4_ * fVar233;
        fVar10 = auVar189._12_4_;
        auVar48._12_4_ = auVar115._12_4_ * fVar10;
        fVar236 = auVar189._16_4_;
        auVar48._16_4_ = auVar115._16_4_ * fVar236;
        fVar11 = auVar189._20_4_;
        auVar48._20_4_ = auVar115._20_4_ * fVar11;
        fVar237 = auVar189._24_4_;
        auVar48._24_4_ = auVar115._24_4_ * fVar237;
        auVar48._28_4_ = auVar130._28_4_;
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = &DAT_3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        auVar130 = vsubps_avx(auVar186,auVar48);
        auVar49._4_4_ = (fVar124 + fVar124) * (fVar2 + fVar2 * auVar130._4_4_);
        auVar49._0_4_ = (fVar108 + fVar108) * (fVar263 + fVar263 * auVar130._0_4_);
        auVar49._8_4_ = (fVar210 + fVar210) * (fVar233 + fVar233 * auVar130._8_4_);
        auVar49._12_4_ = (fVar142 + fVar142) * (fVar10 + fVar10 * auVar130._12_4_);
        auVar49._16_4_ = (fVar238 + fVar238) * (fVar236 + fVar236 * auVar130._16_4_);
        auVar49._20_4_ = (fVar146 + fVar146) * (fVar11 + fVar11 * auVar130._20_4_);
        auVar49._24_4_ = (fVar239 + fVar239) * (fVar237 + fVar237 * auVar130._24_4_);
        auVar49._28_4_ = fVar149 + fVar149;
        _local_5f40 = *(undefined1 (*) [32])(ray + 0x100);
        auVar130 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar49,2);
        auVar189 = vcmpps_avx(auVar49,_local_5f40,2);
        auVar130 = vandps_avx(auVar130,auVar189);
        auVar189 = vcmpps_avx(auVar115,_DAT_02020f00,4);
        auVar130 = vandps_avx(auVar189,auVar130);
        auVar151 = vpslld_avx(auVar130._0_16_,0x1f);
        auVar152 = vpsrad_avx(auVar151,0x1f);
        auVar151 = vpslld_avx(auVar130._16_16_,0x1f);
        auVar151 = vpsrad_avx(auVar151,0x1f);
        auVar116._16_16_ = auVar151;
        auVar116._0_16_ = auVar152;
        auVar130 = vandps_avx(auVar171,local_5f00);
        auVar189 = auVar130 & auVar116;
        auVar171 = vcmpps_avx(auVar224,auVar224,0xf);
        auVar292 = ZEXT3264(auVar171);
        local_5920 = auVar226;
        if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar189 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar189 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar189 >> 0x7f,0) == '\0') &&
              (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar189 >> 0xbf,0) == '\0') &&
            (auVar189 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar189[0x1f]) goto LAB_0048a907;
        auVar130 = vandps_avx(auVar116,auVar130);
        pGVar7 = (context->scene->geometries).items[uVar5].ptr;
        uVar3 = pGVar7->mask;
        auVar155._4_4_ = uVar3;
        auVar155._0_4_ = uVar3;
        auVar155._8_4_ = uVar3;
        auVar155._12_4_ = uVar3;
        auVar155._16_4_ = uVar3;
        auVar155._20_4_ = uVar3;
        auVar155._24_4_ = uVar3;
        auVar155._28_4_ = uVar3;
        auVar189 = vandps_avx(auVar155,*(undefined1 (*) [32])(ray + 0x120));
        auVar151 = vpcmpeqd_avx(auVar189._16_16_,ZEXT816(0) << 0x20);
        auVar152 = vpcmpeqd_avx(auVar189._0_16_,ZEXT816(0) << 0x20);
        auVar174._16_16_ = auVar151;
        auVar174._0_16_ = auVar130._0_16_;
        auVar189 = vblendps_avx(ZEXT1632(auVar152),auVar174,0xf0);
        auVar219 = auVar130 & ~auVar189;
        auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        uVar105 = local_5f48;
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0x7f,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0xbf,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar219[0x1f] < '\0') {
          auVar120 = vandnps_avx(auVar189,auVar130);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (auVar272 = ZEXT436((uint)auVar264._28_4_),
             pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar130 = vrcpps_avx(auVar226);
            fVar263 = auVar130._0_4_;
            fVar2 = auVar130._4_4_;
            auVar81._4_4_ = auVar226._4_4_ * fVar2;
            auVar81._0_4_ = auVar226._0_4_ * fVar263;
            fVar233 = auVar130._8_4_;
            auVar81._8_4_ = auVar226._8_4_ * fVar233;
            fVar10 = auVar130._12_4_;
            auVar81._12_4_ = auVar226._12_4_ * fVar10;
            fVar236 = auVar130._16_4_;
            auVar81._16_4_ = auVar226._16_4_ * fVar236;
            fVar11 = auVar130._20_4_;
            auVar81._20_4_ = auVar226._20_4_ * fVar11;
            fVar237 = auVar130._24_4_;
            auVar81._24_4_ = auVar226._24_4_ * fVar237;
            auVar81._28_4_ = auVar226._28_4_;
            auVar212._8_4_ = 0x3f800000;
            auVar212._0_8_ = &DAT_3f8000003f800000;
            auVar212._12_4_ = 0x3f800000;
            auVar212._16_4_ = 0x3f800000;
            auVar212._20_4_ = 0x3f800000;
            auVar212._24_4_ = 0x3f800000;
            auVar212._28_4_ = 0x3f800000;
            auVar189 = vsubps_avx(auVar212,auVar81);
            auVar157._0_4_ = fVar263 + fVar263 * auVar189._0_4_;
            auVar157._4_4_ = fVar2 + fVar2 * auVar189._4_4_;
            auVar157._8_4_ = fVar233 + fVar233 * auVar189._8_4_;
            auVar157._12_4_ = fVar10 + fVar10 * auVar189._12_4_;
            auVar157._16_4_ = fVar236 + fVar236 * auVar189._16_4_;
            auVar157._20_4_ = fVar11 + fVar11 * auVar189._20_4_;
            auVar157._24_4_ = fVar237 + fVar237 * auVar189._24_4_;
            auVar157._28_4_ = auVar130._28_4_ + auVar189._28_4_;
            auVar176._8_4_ = 0x219392ef;
            auVar176._0_8_ = 0x219392ef219392ef;
            auVar176._12_4_ = 0x219392ef;
            auVar176._16_4_ = 0x219392ef;
            auVar176._20_4_ = 0x219392ef;
            auVar176._24_4_ = 0x219392ef;
            auVar176._28_4_ = 0x219392ef;
            auVar189 = vcmpps_avx(local_5900,auVar176,5);
            auVar130 = vandps_avx(auVar189,auVar157);
            auVar82._4_4_ = auVar130._4_4_ * local_58e0._4_4_;
            auVar82._0_4_ = auVar130._0_4_ * local_58e0._0_4_;
            auVar82._8_4_ = auVar130._8_4_ * local_58e0._8_4_;
            auVar82._12_4_ = auVar130._12_4_ * local_58e0._12_4_;
            auVar82._16_4_ = auVar130._16_4_ * local_58e0._16_4_;
            auVar82._20_4_ = auVar130._20_4_ * local_58e0._20_4_;
            auVar82._24_4_ = auVar130._24_4_ * local_58e0._24_4_;
            auVar82._28_4_ = auVar189._28_4_;
            auVar189 = vminps_avx(auVar82,auVar212);
            auVar83._4_4_ = auVar264._4_4_ * auVar130._4_4_;
            auVar83._0_4_ = auVar264._0_4_ * auVar130._0_4_;
            auVar83._8_4_ = auVar264._8_4_ * auVar130._8_4_;
            auVar83._12_4_ = auVar264._12_4_ * auVar130._12_4_;
            auVar83._16_4_ = auVar264._16_4_ * auVar130._16_4_;
            auVar83._20_4_ = auVar264._20_4_ * auVar130._20_4_;
            auVar83._24_4_ = auVar264._24_4_ * auVar130._24_4_;
            auVar83._28_4_ = auVar130._28_4_;
            auVar130 = vminps_avx(auVar83,auVar212);
            auVar219 = vsubps_avx(auVar212,auVar189);
            auVar224 = vsubps_avx(auVar212,auVar130);
            auVar221 = ZEXT3264(local_5960);
            local_5c00 = vblendvps_avx(auVar189,auVar219,local_5960);
            local_5be0 = vblendvps_avx(auVar130,auVar224,local_5960);
            pRVar8 = context->user;
            local_5ba0 = vpshufd_avx(ZEXT416(uVar5),0);
            local_5bc0 = vpshufd_avx(ZEXT416(uVar4),0);
            local_5eb8[1] = auVar171;
            *local_5eb8 = auVar171;
            local_5b80 = pRVar8->instID[0];
            local_5b60 = pRVar8->instPrimID[0];
            auVar130 = vblendvps_avx(_local_5f40,auVar49,auVar120);
            *(undefined1 (*) [32])(ray + 0x100) = auVar130;
            local_5eb0.valid = (int *)local_5ee0;
            local_5eb0.geometryUserPtr = pGVar7->userPtr;
            local_5eb0.context = context->user;
            local_5eb0.hit = local_5c60;
            local_5eb0.N = 8;
            local_5ee0._0_32_ = auVar120;
            local_5eb0.ray = (RTCRayN *)ray;
            local_5c60 = (RTCHitN  [32])auVar173;
            local_5c40 = auVar185;
            local_5c20 = auVar172;
            local_5bb0 = local_5bc0;
            local_5b90 = local_5ba0;
            uStack_5b7c = local_5b80;
            uStack_5b78 = local_5b80;
            uStack_5b74 = local_5b80;
            uStack_5b70 = local_5b80;
            uStack_5b6c = local_5b80;
            uStack_5b68 = local_5b80;
            uStack_5b64 = local_5b80;
            uStack_5b5c = local_5b60;
            uStack_5b58 = local_5b60;
            uStack_5b54 = local_5b60;
            uStack_5b50 = local_5b60;
            uStack_5b4c = local_5b60;
            uStack_5b48 = local_5b60;
            uStack_5b44 = local_5b60;
            auVar272 = ZEXT436((uint)auVar264._28_4_);
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar191 = ZEXT1664(auVar172._0_16_);
              auVar221 = ZEXT1664(auVar153._0_16_);
              auVar234 = ZEXT1664(auVar173._0_16_);
              auVar272 = (undefined1  [36])0x0;
              auVar153 = ZEXT1632(auVar171._0_16_);
              local_5f10 = ray;
              (*pGVar7->occlusionFilterN)(&local_5eb0);
              auVar153 = vcmpps_avx(auVar153,auVar153,0xf);
              auVar292 = ZEXT3264(auVar153);
              auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              ray = local_5f10;
            }
            auVar151 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_5ee0._0_16_);
            auVar152 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_5ee0._16_16_);
            auVar119._16_16_ = auVar152;
            auVar119._0_16_ = auVar151;
            auVar153 = auVar292._0_32_ & ~auVar119;
            if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar153 >> 0x7f,0) == '\0') &&
                  (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0xbf,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar153[0x1f]) {
              auVar120._0_4_ = auVar292._0_4_ ^ auVar151._0_4_;
              auVar120._4_4_ = auVar292._4_4_ ^ auVar151._4_4_;
              auVar120._8_4_ = auVar292._8_4_ ^ auVar151._8_4_;
              auVar120._12_4_ = auVar292._12_4_ ^ auVar151._12_4_;
              auVar120._16_4_ = auVar292._16_4_ ^ auVar152._0_4_;
              auVar120._20_4_ = auVar292._20_4_ ^ auVar152._4_4_;
              auVar120._24_4_ = auVar292._24_4_ ^ auVar152._8_4_;
              auVar120._28_4_ = auVar292._28_4_ ^ auVar152._12_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                auVar191 = ZEXT1664(auVar191._0_16_);
                auVar221 = ZEXT1664(auVar221._0_16_);
                auVar234 = ZEXT1664(auVar234._0_16_);
                auVar272 = (undefined1  [36])0x0;
                auVar153 = ZEXT1632(auVar292._0_16_);
                (*p_Var9)(&local_5eb0);
                auVar153 = vcmpps_avx(auVar153,auVar153,0xf);
                auVar292 = ZEXT3264(auVar153);
                auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              }
              auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,local_5ee0._0_16_);
              auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,local_5ee0._16_16_);
              auVar136._16_16_ = auVar152;
              auVar136._0_16_ = auVar151;
              auVar120._0_4_ = auVar292._0_4_ ^ auVar151._0_4_;
              auVar120._4_4_ = auVar292._4_4_ ^ auVar151._4_4_;
              auVar120._8_4_ = auVar292._8_4_ ^ auVar151._8_4_;
              auVar120._12_4_ = auVar292._12_4_ ^ auVar151._12_4_;
              auVar120._16_4_ = auVar292._16_4_ ^ auVar152._0_4_;
              auVar120._20_4_ = auVar292._20_4_ ^ auVar152._4_4_;
              auVar120._24_4_ = auVar292._24_4_ ^ auVar152._8_4_;
              auVar120._28_4_ = auVar292._28_4_ ^ auVar152._12_4_;
              auVar158._8_4_ = 0xff800000;
              auVar158._0_8_ = 0xff800000ff800000;
              auVar158._12_4_ = 0xff800000;
              auVar158._16_4_ = 0xff800000;
              auVar158._20_4_ = 0xff800000;
              auVar158._24_4_ = 0xff800000;
              auVar158._28_4_ = 0xff800000;
              auVar153 = vblendvps_avx(auVar158,*(undefined1 (*) [32])(local_5eb0.ray + 0x100),
                                       auVar136);
              *(undefined1 (*) [32])(local_5eb0.ray + 0x100) = auVar153;
            }
            auVar153 = vblendvps_avx(_local_5f40,*(undefined1 (*) [32])local_5f08,auVar120);
            *(undefined1 (*) [32])local_5f08 = auVar153;
          }
          local_5f00 = vandnps_avx(auVar120,local_5f00);
          uVar105 = local_5f48;
        }
      }
      if ((((((((local_5f00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5f00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5f00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5f00 >> 0x7f,0) == '\0') &&
            (local_5f00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5f00 >> 0xbf,0) == '\0') &&
          (local_5f00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5f00[0x1f]) {
        bVar107 = false;
      }
      else {
        auVar153 = *(undefined1 (*) [32])ray;
        auVar130 = *(undefined1 (*) [32])(ray + 0x20);
        auVar171 = *(undefined1 (*) [32])(ray + 0x40);
        auVar93._4_4_ = fStack_587c;
        auVar93._0_4_ = local_5880;
        auVar93._8_4_ = fStack_5878;
        auVar93._12_4_ = fStack_5874;
        auVar93._16_4_ = fStack_5870;
        auVar93._20_4_ = fStack_586c;
        auVar93._24_4_ = fStack_5868;
        auVar93._28_4_ = fStack_5864;
        _local_5c80 = vsubps_avx(auVar93,auVar153);
        auVar92._4_4_ = fStack_589c;
        auVar92._0_4_ = local_58a0;
        auVar92._8_4_ = fStack_5898;
        auVar92._12_4_ = fStack_5894;
        auVar92._16_4_ = fStack_5890;
        auVar92._20_4_ = fStack_588c;
        auVar92._24_4_ = fStack_5888;
        auVar92._28_4_ = fStack_5884;
        local_5ca0 = vsubps_avx(auVar92,auVar130);
        auVar91._4_4_ = fStack_58bc;
        auVar91._0_4_ = local_58c0;
        auVar91._8_4_ = fStack_58b8;
        auVar91._12_4_ = fStack_58b4;
        auVar91._16_4_ = fStack_58b0;
        auVar91._20_4_ = fStack_58ac;
        auVar91._24_4_ = fStack_58a8;
        auVar91._28_4_ = fStack_58a4;
        local_5cc0 = vsubps_avx(auVar91,auVar171);
        auVar172 = vsubps_avx(local_5da0,auVar153);
        auVar173 = vsubps_avx(local_5dc0,auVar130);
        auVar185 = vsubps_avx(local_5de0,auVar171);
        auVar153 = vsubps_avx(local_5860,auVar153);
        auVar130 = vsubps_avx(local_5e00,auVar130);
        auVar171 = vsubps_avx(local_5840,auVar171);
        local_5ce0 = vsubps_avx(auVar153,_local_5c80);
        local_5d00 = vsubps_avx(auVar130,local_5ca0);
        local_5d20 = vsubps_avx(auVar171,local_5cc0);
        fVar263 = local_5ca0._0_4_;
        fVar128 = auVar130._0_4_ + fVar263;
        fVar233 = local_5ca0._4_4_;
        fVar139 = auVar130._4_4_ + fVar233;
        fVar236 = local_5ca0._8_4_;
        fVar215 = auVar130._8_4_ + fVar236;
        fVar237 = local_5ca0._12_4_;
        fVar216 = auVar130._12_4_ + fVar237;
        fVar238 = local_5ca0._16_4_;
        fVar144 = auVar130._16_4_ + fVar238;
        fVar239 = local_5ca0._20_4_;
        fVar147 = auVar130._20_4_ + fVar239;
        fVar240 = local_5ca0._24_4_;
        fVar217 = auVar130._24_4_ + fVar240;
        fVar193 = auVar130._28_4_;
        fVar2 = local_5cc0._0_4_;
        fVar218 = auVar171._0_4_ + fVar2;
        fVar10 = local_5cc0._4_4_;
        fVar195 = auVar171._4_4_ + fVar10;
        fVar11 = local_5cc0._8_4_;
        fVar198 = auVar171._8_4_ + fVar11;
        fVar142 = local_5cc0._12_4_;
        fVar244 = auVar171._12_4_ + fVar142;
        fVar146 = local_5cc0._16_4_;
        fVar249 = auVar171._16_4_ + fVar146;
        fVar149 = local_5cc0._20_4_;
        fVar205 = auVar171._20_4_ + fVar149;
        fVar12 = local_5cc0._24_4_;
        fVar208 = auVar171._24_4_ + fVar12;
        fVar241 = local_5cc0._28_4_;
        fVar196 = auVar171._28_4_;
        fVar108 = local_5d20._0_4_;
        auVar191._0_4_ = fVar128 * fVar108;
        fVar124 = local_5d20._4_4_;
        auVar191._4_4_ = fVar139 * fVar124;
        fVar210 = local_5d20._8_4_;
        auVar191._8_4_ = fVar215 * fVar210;
        fVar125 = local_5d20._12_4_;
        auVar191._12_4_ = fVar216 * fVar125;
        fVar126 = local_5d20._16_4_;
        auVar191._16_4_ = fVar144 * fVar126;
        fVar213 = local_5d20._20_4_;
        auVar191._20_4_ = fVar147 * fVar213;
        fVar214 = local_5d20._24_4_;
        auVar191._28_36_ = auVar248._28_36_;
        auVar191._24_4_ = fVar217 * fVar214;
        fVar290 = local_5d00._0_4_;
        auVar221._0_4_ = fVar290 * fVar218;
        fVar293 = local_5d00._4_4_;
        auVar221._4_4_ = fVar293 * fVar195;
        fVar294 = local_5d00._8_4_;
        auVar221._8_4_ = fVar294 * fVar198;
        fVar295 = local_5d00._12_4_;
        auVar221._12_4_ = fVar295 * fVar244;
        fVar296 = local_5d00._16_4_;
        auVar221._16_4_ = fVar296 * fVar249;
        fVar297 = local_5d00._20_4_;
        auVar221._20_4_ = fVar297 * fVar205;
        fVar298 = local_5d00._24_4_;
        auVar221._24_4_ = fVar298 * fVar208;
        auVar221._28_36_ = auVar272;
        auVar189 = vsubps_avx(auVar221._0_32_,auVar191._0_32_);
        fVar199 = local_5c80._0_4_;
        fVar251 = fVar199 + auVar153._0_4_;
        fVar201 = local_5c80._4_4_;
        fVar254 = fVar201 + auVar153._4_4_;
        fVar206 = local_5c80._8_4_;
        fVar252 = fVar206 + auVar153._8_4_;
        fVar223 = local_5c80._12_4_;
        fVar255 = fVar223 + auVar153._12_4_;
        fVar228 = local_5c80._16_4_;
        fVar257 = fVar228 + auVar153._16_4_;
        fVar230 = local_5c80._20_4_;
        fVar259 = fVar230 + auVar153._20_4_;
        fVar232 = local_5c80._24_4_;
        fVar261 = fVar232 + auVar153._24_4_;
        fVar266 = local_5ce0._0_4_;
        fVar267 = local_5ce0._4_4_;
        auVar50._4_4_ = fVar267 * fVar195;
        auVar50._0_4_ = fVar266 * fVar218;
        fVar268 = local_5ce0._8_4_;
        auVar50._8_4_ = fVar268 * fVar198;
        fVar269 = local_5ce0._12_4_;
        auVar50._12_4_ = fVar269 * fVar244;
        fVar270 = local_5ce0._16_4_;
        auVar50._16_4_ = fVar270 * fVar249;
        fVar271 = local_5ce0._20_4_;
        auVar50._20_4_ = fVar271 * fVar205;
        fVar274 = local_5ce0._24_4_;
        auVar50._24_4_ = fVar274 * fVar208;
        auVar50._28_4_ = fVar196 + fVar241;
        auVar51._4_4_ = fVar254 * fVar124;
        auVar51._0_4_ = fVar251 * fVar108;
        auVar51._8_4_ = fVar252 * fVar210;
        auVar51._12_4_ = fVar255 * fVar125;
        auVar51._16_4_ = fVar257 * fVar126;
        auVar51._20_4_ = fVar259 * fVar213;
        auVar51._24_4_ = fVar261 * fVar214;
        auVar51._28_4_ = auVar272._0_4_;
        auVar219 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = fVar254 * fVar293;
        auVar52._0_4_ = fVar251 * fVar290;
        auVar52._8_4_ = fVar252 * fVar294;
        auVar52._12_4_ = fVar255 * fVar295;
        auVar52._16_4_ = fVar257 * fVar296;
        auVar52._20_4_ = fVar259 * fVar297;
        auVar52._24_4_ = fVar261 * fVar298;
        auVar52._28_4_ = local_5c80._28_4_ + auVar153._28_4_;
        auVar53._4_4_ = fVar267 * fVar139;
        auVar53._0_4_ = fVar266 * fVar128;
        auVar53._8_4_ = fVar268 * fVar215;
        auVar53._12_4_ = fVar269 * fVar216;
        auVar53._16_4_ = fVar270 * fVar144;
        auVar53._20_4_ = fVar271 * fVar147;
        auVar53._24_4_ = fVar274 * fVar217;
        auVar53._28_4_ = fVar193 + local_5ca0._28_4_;
        auVar224 = vsubps_avx(auVar53,auVar52);
        fVar139 = *(float *)(ray + 0xc0);
        fVar215 = *(float *)(ray + 0xc4);
        fVar216 = *(float *)(ray + 200);
        fVar144 = *(float *)(ray + 0xcc);
        fVar147 = *(float *)(ray + 0xd0);
        fVar217 = *(float *)(ray + 0xd4);
        fVar218 = *(float *)(ray + 0xd8);
        auVar94 = *(undefined1 (*) [28])(ray + 0xc0);
        pRVar1 = ray + 0xa0;
        fVar195 = *(float *)pRVar1;
        fVar198 = *(float *)(ray + 0xa4);
        fVar244 = *(float *)(ray + 0xa8);
        fVar249 = *(float *)(ray + 0xac);
        fVar205 = *(float *)(ray + 0xb0);
        fVar208 = *(float *)(ray + 0xb4);
        fVar251 = *(float *)(ray + 0xb8);
        auVar95 = *(undefined1 (*) [28])pRVar1;
        auVar225 = *(undefined1 (*) [32])pRVar1;
        fVar128 = auVar219._28_4_;
        pRVar1 = ray + 0x80;
        fVar254 = *(float *)pRVar1;
        fVar252 = *(float *)(ray + 0x84);
        fVar255 = *(float *)(ray + 0x88);
        fVar257 = *(float *)(ray + 0x8c);
        fVar259 = *(float *)(ray + 0x90);
        fVar261 = *(float *)(ray + 0x94);
        fVar194 = *(float *)(ray + 0x98);
        auVar96 = *(undefined1 (*) [28])pRVar1;
        _local_5d40 = *(undefined1 (*) [32])pRVar1;
        local_5dc0._0_4_ =
             fVar254 * auVar189._0_4_ + fVar139 * auVar224._0_4_ + fVar195 * auVar219._0_4_;
        local_5dc0._4_4_ =
             fVar252 * auVar189._4_4_ + fVar215 * auVar224._4_4_ + fVar198 * auVar219._4_4_;
        local_5dc0._8_4_ =
             fVar255 * auVar189._8_4_ + fVar216 * auVar224._8_4_ + fVar244 * auVar219._8_4_;
        local_5dc0._12_4_ =
             fVar257 * auVar189._12_4_ + fVar144 * auVar224._12_4_ + fVar249 * auVar219._12_4_;
        local_5dc0._16_4_ =
             fVar259 * auVar189._16_4_ + fVar147 * auVar224._16_4_ + fVar205 * auVar219._16_4_;
        local_5dc0._20_4_ =
             fVar261 * auVar189._20_4_ + fVar217 * auVar224._20_4_ + fVar208 * auVar219._20_4_;
        local_5dc0._24_4_ =
             fVar194 * auVar189._24_4_ + fVar218 * auVar224._24_4_ + fVar251 * auVar219._24_4_;
        local_5dc0._28_4_ = fVar128 + auVar224._28_4_ + fVar128;
        local_5d60 = vsubps_avx(local_5ca0,auVar173);
        local_5da0 = vsubps_avx(local_5cc0,auVar185);
        fVar197 = auVar173._0_4_ + fVar263;
        fVar200 = auVar173._4_4_ + fVar233;
        fVar202 = auVar173._8_4_ + fVar236;
        fVar204 = auVar173._12_4_ + fVar237;
        fVar207 = auVar173._16_4_ + fVar238;
        fVar127 = auVar173._20_4_ + fVar239;
        fVar169 = auVar173._24_4_ + fVar240;
        fVar178 = auVar185._0_4_ + fVar2;
        fVar180 = auVar185._4_4_ + fVar10;
        fVar181 = auVar185._8_4_ + fVar11;
        fVar182 = auVar185._12_4_ + fVar142;
        fVar183 = auVar185._16_4_ + fVar146;
        fVar184 = auVar185._20_4_ + fVar149;
        fVar243 = auVar185._24_4_ + fVar12;
        fVar245 = local_5da0._0_4_;
        fVar250 = local_5da0._4_4_;
        auVar54._4_4_ = fVar250 * fVar200;
        auVar54._0_4_ = fVar245 * fVar197;
        fVar253 = local_5da0._8_4_;
        auVar54._8_4_ = fVar253 * fVar202;
        fVar256 = local_5da0._12_4_;
        auVar54._12_4_ = fVar256 * fVar204;
        fVar258 = local_5da0._16_4_;
        auVar54._16_4_ = fVar258 * fVar207;
        fVar260 = local_5da0._20_4_;
        auVar54._20_4_ = fVar260 * fVar127;
        fVar262 = local_5da0._24_4_;
        auVar54._24_4_ = fVar262 * fVar169;
        auVar54._28_4_ = fVar128;
        fVar275 = local_5d60._0_4_;
        fVar278 = local_5d60._4_4_;
        auVar55._4_4_ = fVar278 * fVar180;
        auVar55._0_4_ = fVar275 * fVar178;
        fVar280 = local_5d60._8_4_;
        auVar55._8_4_ = fVar280 * fVar181;
        fVar282 = local_5d60._12_4_;
        auVar55._12_4_ = fVar282 * fVar182;
        fVar284 = local_5d60._16_4_;
        auVar55._16_4_ = fVar284 * fVar183;
        fVar286 = local_5d60._20_4_;
        auVar55._20_4_ = fVar286 * fVar184;
        fVar288 = local_5d60._24_4_;
        auVar55._24_4_ = fVar288 * fVar243;
        auVar55._28_4_ = fVar241;
        auVar189 = vsubps_avx(auVar55,auVar54);
        local_5d80 = vsubps_avx(_local_5c80,auVar172);
        auVar191 = ZEXT3264(local_5d80);
        fVar165 = local_5d80._0_4_;
        fVar166 = local_5d80._4_4_;
        auVar56._4_4_ = fVar166 * fVar180;
        auVar56._0_4_ = fVar165 * fVar178;
        fVar167 = local_5d80._8_4_;
        auVar56._8_4_ = fVar167 * fVar181;
        fVar168 = local_5d80._12_4_;
        auVar56._12_4_ = fVar168 * fVar182;
        fVar170 = local_5d80._16_4_;
        auVar56._16_4_ = fVar170 * fVar183;
        fVar179 = local_5d80._20_4_;
        auVar56._20_4_ = fVar179 * fVar184;
        fVar188 = local_5d80._24_4_;
        auVar56._24_4_ = fVar188 * fVar243;
        auVar56._28_4_ = auVar185._28_4_ + fVar241;
        fVar241 = fVar199 + auVar172._0_4_;
        fVar128 = fVar201 + auVar172._4_4_;
        fVar178 = fVar206 + auVar172._8_4_;
        fVar180 = fVar223 + auVar172._12_4_;
        fVar181 = fVar228 + auVar172._16_4_;
        fVar182 = fVar230 + auVar172._20_4_;
        fVar183 = fVar232 + auVar172._24_4_;
        auVar57._4_4_ = fVar128 * fVar250;
        auVar57._0_4_ = fVar241 * fVar245;
        auVar57._8_4_ = fVar178 * fVar253;
        auVar57._12_4_ = fVar180 * fVar256;
        auVar57._16_4_ = fVar181 * fVar258;
        auVar57._20_4_ = fVar182 * fVar260;
        auVar57._24_4_ = fVar183 * fVar262;
        auVar57._28_4_ = local_5da0._28_4_;
        auVar219 = vsubps_avx(auVar57,auVar56);
        auVar58._4_4_ = fVar128 * fVar278;
        auVar58._0_4_ = fVar241 * fVar275;
        auVar58._8_4_ = fVar178 * fVar280;
        auVar58._12_4_ = fVar180 * fVar282;
        auVar58._16_4_ = fVar181 * fVar284;
        auVar58._20_4_ = fVar182 * fVar286;
        auVar58._24_4_ = fVar183 * fVar288;
        auVar58._28_4_ = local_5c80._28_4_ + auVar172._28_4_;
        auVar59._4_4_ = fVar166 * fVar200;
        auVar59._0_4_ = fVar165 * fVar197;
        auVar59._8_4_ = fVar167 * fVar202;
        auVar59._12_4_ = fVar168 * fVar204;
        auVar59._16_4_ = fVar170 * fVar207;
        auVar59._20_4_ = fVar179 * fVar127;
        auVar59._24_4_ = fVar188 * fVar169;
        auVar59._28_4_ = auVar173._28_4_ + local_5ca0._28_4_;
        auVar224 = vsubps_avx(auVar59,auVar58);
        local_5e60._0_4_ = auVar189._0_4_;
        local_5e60._4_4_ = auVar189._4_4_;
        auStack_5e58._0_4_ = auVar189._8_4_;
        auStack_5e58._4_4_ = auVar189._12_4_;
        fStack_5e50 = auVar189._16_4_;
        fStack_5e4c = auVar189._20_4_;
        fStack_5e48 = auVar189._24_4_;
        local_5de0._0_4_ =
             fVar254 * (float)local_5e60._0_4_ + fVar139 * auVar224._0_4_ + fVar195 * auVar219._0_4_
        ;
        local_5de0._4_4_ =
             fVar252 * (float)local_5e60._4_4_ + fVar215 * auVar224._4_4_ + fVar198 * auVar219._4_4_
        ;
        local_5de0._8_4_ =
             fVar255 * (float)auStack_5e58._0_4_ +
             fVar216 * auVar224._8_4_ + fVar244 * auVar219._8_4_;
        local_5de0._12_4_ =
             fVar257 * (float)auStack_5e58._4_4_ +
             fVar144 * auVar224._12_4_ + fVar249 * auVar219._12_4_;
        local_5de0._16_4_ =
             fVar259 * fStack_5e50 + fVar147 * auVar224._16_4_ + fVar205 * auVar219._16_4_;
        local_5de0._20_4_ =
             fVar261 * fStack_5e4c + fVar217 * auVar224._20_4_ + fVar208 * auVar219._20_4_;
        local_5de0._24_4_ =
             fVar194 * fStack_5e48 + fVar218 * auVar224._24_4_ + fVar251 * auVar219._24_4_;
        local_5de0._28_4_ = auVar219._28_4_ + auVar224._28_4_ + auVar219._28_4_;
        auVar189 = vsubps_avx(auVar172,auVar153);
        fVar127 = auVar172._0_4_ + auVar153._0_4_;
        fVar169 = auVar172._4_4_ + auVar153._4_4_;
        fVar178 = auVar172._8_4_ + auVar153._8_4_;
        fVar180 = auVar172._12_4_ + auVar153._12_4_;
        fVar181 = auVar172._16_4_ + auVar153._16_4_;
        fVar182 = auVar172._20_4_ + auVar153._20_4_;
        fVar183 = auVar172._24_4_ + auVar153._24_4_;
        auVar219 = vsubps_avx(auVar173,auVar130);
        auVar234 = ZEXT3264(auVar219);
        fVar184 = auVar173._0_4_ + auVar130._0_4_;
        fVar243 = auVar173._4_4_ + auVar130._4_4_;
        fVar140 = auVar173._8_4_ + auVar130._8_4_;
        fVar141 = auVar173._12_4_ + auVar130._12_4_;
        fVar143 = auVar173._16_4_ + auVar130._16_4_;
        fVar145 = auVar173._20_4_ + auVar130._20_4_;
        fVar148 = auVar173._24_4_ + auVar130._24_4_;
        fVar150 = auVar173._28_4_ + fVar193;
        auVar130 = vsubps_avx(auVar185,auVar171);
        fVar197 = auVar185._0_4_ + auVar171._0_4_;
        fVar200 = auVar185._4_4_ + auVar171._4_4_;
        fVar202 = auVar185._8_4_ + auVar171._8_4_;
        fVar204 = auVar185._12_4_ + auVar171._12_4_;
        fVar207 = auVar185._16_4_ + auVar171._16_4_;
        fVar163 = auVar185._20_4_ + auVar171._20_4_;
        fVar164 = auVar185._24_4_ + auVar171._24_4_;
        fVar276 = auVar130._0_4_;
        fVar279 = auVar130._4_4_;
        auVar60._4_4_ = fVar279 * fVar243;
        auVar60._0_4_ = fVar276 * fVar184;
        fVar281 = auVar130._8_4_;
        auVar60._8_4_ = fVar281 * fVar140;
        fVar283 = auVar130._12_4_;
        auVar60._12_4_ = fVar283 * fVar141;
        fVar285 = auVar130._16_4_;
        auVar60._16_4_ = fVar285 * fVar143;
        fVar287 = auVar130._20_4_;
        auVar60._20_4_ = fVar287 * fVar145;
        fVar289 = auVar130._24_4_;
        auVar60._24_4_ = fVar289 * fVar148;
        auVar60._28_4_ = fVar193;
        fVar193 = auVar219._0_4_;
        fVar203 = auVar219._4_4_;
        auVar61._4_4_ = fVar203 * fVar200;
        auVar61._0_4_ = fVar193 * fVar197;
        fVar209 = auVar219._8_4_;
        auVar61._8_4_ = fVar209 * fVar202;
        fVar227 = auVar219._12_4_;
        auVar61._12_4_ = fVar227 * fVar204;
        fVar229 = auVar219._16_4_;
        auVar61._16_4_ = fVar229 * fVar207;
        fVar231 = auVar219._20_4_;
        auVar61._20_4_ = fVar231 * fVar163;
        fVar242 = auVar219._24_4_;
        auVar61._24_4_ = fVar242 * fVar164;
        auVar61._28_4_ = fVar196;
        auVar130 = vsubps_avx(auVar61,auVar60);
        fVar241 = auVar189._0_4_;
        fVar128 = auVar189._4_4_;
        auVar62._4_4_ = fVar128 * fVar200;
        auVar62._0_4_ = fVar241 * fVar197;
        fVar197 = auVar189._8_4_;
        auVar62._8_4_ = fVar197 * fVar202;
        fVar200 = auVar189._12_4_;
        auVar62._12_4_ = fVar200 * fVar204;
        fVar202 = auVar189._16_4_;
        auVar62._16_4_ = fVar202 * fVar207;
        fVar204 = auVar189._20_4_;
        auVar62._20_4_ = fVar204 * fVar163;
        fVar207 = auVar189._24_4_;
        auVar62._24_4_ = fVar207 * fVar164;
        auVar62._28_4_ = auVar185._28_4_ + fVar196;
        auVar63._4_4_ = fVar279 * fVar169;
        auVar63._0_4_ = fVar276 * fVar127;
        auVar63._8_4_ = fVar281 * fVar178;
        auVar63._12_4_ = fVar283 * fVar180;
        auVar63._16_4_ = fVar285 * fVar181;
        auVar63._20_4_ = fVar287 * fVar182;
        auVar63._24_4_ = fVar289 * fVar183;
        auVar63._28_4_ = fVar196;
        auVar171 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = fVar203 * fVar169;
        auVar64._0_4_ = fVar193 * fVar127;
        auVar64._8_4_ = fVar209 * fVar178;
        auVar64._12_4_ = fVar227 * fVar180;
        auVar64._16_4_ = fVar229 * fVar181;
        auVar64._20_4_ = fVar231 * fVar182;
        auVar64._24_4_ = fVar242 * fVar183;
        auVar64._28_4_ = auVar172._28_4_ + auVar153._28_4_;
        auVar65._4_4_ = fVar128 * fVar243;
        auVar65._0_4_ = fVar241 * fVar184;
        auVar65._8_4_ = fVar197 * fVar140;
        auVar65._12_4_ = fVar200 * fVar141;
        auVar65._16_4_ = fVar202 * fVar143;
        auVar65._20_4_ = fVar204 * fVar145;
        auVar65._24_4_ = fVar207 * fVar148;
        auVar65._28_4_ = fVar150;
        auVar153 = vsubps_avx(auVar65,auVar64);
        auVar291._8_4_ = 0x7fffffff;
        auVar291._0_8_ = 0x7fffffff7fffffff;
        auVar291._12_4_ = 0x7fffffff;
        auVar291._16_4_ = 0x7fffffff;
        auVar291._20_4_ = 0x7fffffff;
        auVar291._24_4_ = 0x7fffffff;
        auVar291._28_4_ = 0x7fffffff;
        auVar156._0_4_ =
             fVar254 * auVar130._0_4_ + fVar139 * auVar153._0_4_ + fVar195 * auVar171._0_4_;
        auVar156._4_4_ =
             fVar252 * auVar130._4_4_ + fVar215 * auVar153._4_4_ + fVar198 * auVar171._4_4_;
        auVar156._8_4_ =
             fVar255 * auVar130._8_4_ + fVar216 * auVar153._8_4_ + fVar244 * auVar171._8_4_;
        auVar156._12_4_ =
             fVar257 * auVar130._12_4_ + fVar144 * auVar153._12_4_ + fVar249 * auVar171._12_4_;
        auVar156._16_4_ =
             fVar259 * auVar130._16_4_ + fVar147 * auVar153._16_4_ + fVar205 * auVar171._16_4_;
        auVar156._20_4_ =
             fVar261 * auVar130._20_4_ + fVar217 * auVar153._20_4_ + fVar208 * auVar171._20_4_;
        auVar156._24_4_ =
             fVar194 * auVar130._24_4_ + fVar218 * auVar153._24_4_ + fVar251 * auVar171._24_4_;
        auVar156._28_4_ = fVar150 + auVar153._28_4_ + fVar150;
        auVar265._0_4_ = auVar156._0_4_ + local_5dc0._0_4_ + local_5de0._0_4_;
        auVar265._4_4_ = auVar156._4_4_ + local_5dc0._4_4_ + local_5de0._4_4_;
        auVar265._8_4_ = auVar156._8_4_ + local_5dc0._8_4_ + local_5de0._8_4_;
        auVar265._12_4_ = auVar156._12_4_ + local_5dc0._12_4_ + local_5de0._12_4_;
        auVar265._16_4_ = auVar156._16_4_ + local_5dc0._16_4_ + local_5de0._16_4_;
        auVar265._20_4_ = auVar156._20_4_ + local_5dc0._20_4_ + local_5de0._20_4_;
        auVar265._24_4_ = auVar156._24_4_ + local_5dc0._24_4_ + local_5de0._24_4_;
        auVar265._28_4_ = auVar156._28_4_ + local_5dc0._28_4_ + local_5de0._28_4_;
        auVar153 = vminps_avx(local_5dc0,local_5de0);
        auVar130 = vminps_avx(auVar153,auVar156);
        auVar153 = vandps_avx(auVar265,auVar291);
        auVar221 = ZEXT3264(auVar153);
        fVar139 = auVar153._0_4_ * 1.1920929e-07;
        fVar215 = auVar153._4_4_ * 1.1920929e-07;
        auVar66._4_4_ = fVar215;
        auVar66._0_4_ = fVar139;
        fVar216 = auVar153._8_4_ * 1.1920929e-07;
        auVar66._8_4_ = fVar216;
        fVar144 = auVar153._12_4_ * 1.1920929e-07;
        auVar66._12_4_ = fVar144;
        fVar147 = auVar153._16_4_ * 1.1920929e-07;
        auVar66._16_4_ = fVar147;
        fVar217 = auVar153._20_4_ * 1.1920929e-07;
        auVar66._20_4_ = fVar217;
        fVar218 = auVar153._24_4_ * 1.1920929e-07;
        auVar66._24_4_ = fVar218;
        auVar66._28_4_ = 0x34000000;
        auVar211._0_8_ = CONCAT44(fVar215,fVar139) ^ 0x8000000080000000;
        auVar211._8_4_ = -fVar216;
        auVar211._12_4_ = -fVar144;
        auVar211._16_4_ = -fVar147;
        auVar211._20_4_ = -fVar217;
        auVar211._24_4_ = -fVar218;
        auVar211._28_4_ = 0xb4000000;
        auVar130 = vcmpps_avx(auVar130,auVar211,5);
        auVar171 = vmaxps_avx(local_5dc0,local_5de0);
        auVar171 = vmaxps_avx(auVar171,auVar156);
        auVar171 = vcmpps_avx(auVar171,auVar66,2);
        auVar172 = vorps_avx(auVar130,auVar171);
        auVar173 = local_5f00 & auVar172;
        _local_5e60 = auVar225;
        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar173 >> 0x7f,0) == '\0') &&
              (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar173 >> 0xbf,0) == '\0') &&
            (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar173[0x1f]) {
LAB_0048a92e:
          auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar153 = vcmpps_avx(auVar291,auVar291,0xf);
          auVar292 = ZEXT3264(auVar153);
        }
        else {
          auVar67._4_4_ = fVar124 * fVar278;
          auVar67._0_4_ = fVar108 * fVar275;
          auVar67._8_4_ = fVar210 * fVar280;
          auVar67._12_4_ = fVar125 * fVar282;
          auVar67._16_4_ = fVar126 * fVar284;
          auVar67._20_4_ = fVar213 * fVar286;
          auVar67._24_4_ = fVar214 * fVar288;
          auVar67._28_4_ = auVar171._28_4_;
          auVar68._4_4_ = fVar293 * fVar250;
          auVar68._0_4_ = fVar290 * fVar245;
          auVar68._8_4_ = fVar294 * fVar253;
          auVar68._12_4_ = fVar295 * fVar256;
          auVar68._16_4_ = fVar296 * fVar258;
          auVar68._20_4_ = fVar297 * fVar260;
          auVar68._24_4_ = fVar298 * fVar262;
          auVar68._28_4_ = auVar130._28_4_;
          auVar185 = vsubps_avx(auVar68,auVar67);
          auVar69._4_4_ = fVar203 * fVar250;
          auVar69._0_4_ = fVar193 * fVar245;
          auVar69._8_4_ = fVar209 * fVar253;
          auVar69._12_4_ = fVar227 * fVar256;
          auVar69._16_4_ = fVar229 * fVar258;
          auVar69._20_4_ = fVar231 * fVar260;
          auVar69._24_4_ = fVar242 * fVar262;
          auVar69._28_4_ = 0x34000000;
          auVar70._4_4_ = fVar279 * fVar278;
          auVar70._0_4_ = fVar276 * fVar275;
          auVar70._8_4_ = fVar281 * fVar280;
          auVar70._12_4_ = fVar283 * fVar282;
          auVar70._16_4_ = fVar285 * fVar284;
          auVar70._20_4_ = fVar287 * fVar286;
          auVar70._24_4_ = fVar289 * fVar288;
          auVar70._28_4_ = auVar153._28_4_;
          auVar173 = vsubps_avx(auVar70,auVar69);
          auVar130 = vandps_avx(auVar291,auVar67);
          auVar171 = vandps_avx(auVar291,auVar69);
          auVar130 = vcmpps_avx(auVar130,auVar171,1);
          auVar173 = vblendvps_avx(auVar173,auVar185,auVar130);
          auVar71._4_4_ = fVar166 * fVar279;
          auVar71._0_4_ = fVar165 * fVar276;
          auVar71._8_4_ = fVar167 * fVar281;
          auVar71._12_4_ = fVar168 * fVar283;
          auVar71._16_4_ = fVar170 * fVar285;
          auVar71._20_4_ = fVar179 * fVar287;
          auVar71._24_4_ = fVar188 * fVar289;
          auVar71._28_4_ = auVar130._28_4_;
          auVar72._4_4_ = fVar166 * fVar124;
          auVar72._0_4_ = fVar165 * fVar108;
          auVar72._8_4_ = fVar167 * fVar210;
          auVar72._12_4_ = fVar168 * fVar125;
          auVar72._16_4_ = fVar170 * fVar126;
          auVar72._20_4_ = fVar179 * fVar213;
          auVar72._24_4_ = fVar188 * fVar214;
          auVar72._28_4_ = auVar185._28_4_;
          auVar73._4_4_ = fVar267 * fVar250;
          auVar73._0_4_ = fVar266 * fVar245;
          auVar73._8_4_ = fVar268 * fVar253;
          auVar73._12_4_ = fVar269 * fVar256;
          auVar73._16_4_ = fVar270 * fVar258;
          auVar73._20_4_ = fVar271 * fVar260;
          auVar73._24_4_ = fVar274 * fVar262;
          auVar73._28_4_ = auVar171._28_4_;
          auVar219 = vsubps_avx(auVar72,auVar73);
          auVar74._4_4_ = fVar128 * fVar250;
          auVar74._0_4_ = fVar241 * fVar245;
          auVar74._8_4_ = fVar197 * fVar253;
          auVar74._12_4_ = fVar200 * fVar256;
          auVar74._16_4_ = fVar202 * fVar258;
          auVar74._20_4_ = fVar204 * fVar260;
          auVar74._24_4_ = fVar207 * fVar262;
          auVar74._28_4_ = local_5da0._28_4_;
          auVar185 = vsubps_avx(auVar74,auVar71);
          auVar191 = ZEXT3264(auVar185);
          auVar130 = vandps_avx(auVar291,auVar73);
          auVar171 = vandps_avx(auVar291,auVar71);
          auVar130 = vcmpps_avx(auVar130,auVar171,1);
          auVar185 = vblendvps_avx(auVar185,auVar219,auVar130);
          auVar234 = ZEXT3264(auVar185);
          auVar75._4_4_ = fVar128 * fVar278;
          auVar75._0_4_ = fVar241 * fVar275;
          auVar75._8_4_ = fVar197 * fVar280;
          auVar75._12_4_ = fVar200 * fVar282;
          auVar75._16_4_ = fVar202 * fVar284;
          auVar75._20_4_ = fVar204 * fVar286;
          auVar75._24_4_ = fVar207 * fVar288;
          auVar75._28_4_ = auVar189._28_4_;
          auVar76._4_4_ = fVar267 * fVar278;
          auVar76._0_4_ = fVar266 * fVar275;
          auVar76._8_4_ = fVar268 * fVar280;
          auVar76._12_4_ = fVar269 * fVar282;
          auVar76._16_4_ = fVar270 * fVar284;
          auVar76._20_4_ = fVar271 * fVar286;
          auVar76._24_4_ = fVar274 * fVar288;
          auVar76._28_4_ = auVar130._28_4_;
          auVar77._4_4_ = fVar166 * fVar293;
          auVar77._0_4_ = fVar165 * fVar290;
          auVar77._8_4_ = fVar167 * fVar294;
          auVar77._12_4_ = fVar168 * fVar295;
          auVar77._16_4_ = fVar170 * fVar296;
          auVar77._20_4_ = fVar179 * fVar297;
          auVar77._24_4_ = fVar188 * fVar298;
          auVar77._28_4_ = auVar219._28_4_;
          auVar78._4_4_ = fVar166 * fVar203;
          auVar78._0_4_ = fVar165 * fVar193;
          auVar78._8_4_ = fVar167 * fVar209;
          auVar78._12_4_ = fVar168 * fVar227;
          auVar78._16_4_ = fVar170 * fVar229;
          auVar78._20_4_ = fVar179 * fVar231;
          auVar78._24_4_ = fVar188 * fVar242;
          auVar78._28_4_ = local_5d60._28_4_;
          auVar219 = vsubps_avx(auVar76,auVar77);
          auVar224 = vsubps_avx(auVar78,auVar75);
          auVar130 = vandps_avx(auVar291,auVar77);
          auVar171 = vandps_avx(auVar291,auVar75);
          auVar189 = vcmpps_avx(auVar130,auVar171,1);
          auVar171 = vblendvps_avx(auVar224,auVar219,auVar189);
          auVar221 = ZEXT3264(auVar171);
          local_5f40._0_4_ = auVar94._0_4_;
          local_5f40._4_4_ = auVar94._4_4_;
          fStack_5f38 = auVar94._8_4_;
          fStack_5f34 = auVar94._12_4_;
          fStack_5f30 = auVar94._16_4_;
          fStack_5f2c = auVar94._20_4_;
          fStack_5f28 = auVar94._24_4_;
          local_5e60._0_4_ = auVar95._0_4_;
          local_5e60._4_4_ = auVar95._4_4_;
          auStack_5e58._0_4_ = auVar95._8_4_;
          auStack_5e58._4_4_ = auVar95._12_4_;
          fStack_5e50 = auVar95._16_4_;
          fStack_5e4c = auVar95._20_4_;
          fStack_5e48 = auVar95._24_4_;
          local_5d40._0_4_ = auVar96._0_4_;
          local_5d40._4_4_ = auVar96._4_4_;
          fStack_5d38 = auVar96._8_4_;
          fStack_5d34 = auVar96._12_4_;
          fStack_5d30 = auVar96._16_4_;
          fStack_5d2c = auVar96._20_4_;
          fStack_5d28 = auVar96._24_4_;
          fVar241 = auVar173._0_4_ * (float)local_5d40._0_4_ +
                    auVar171._0_4_ * (float)local_5f40._0_4_ +
                    auVar185._0_4_ * (float)local_5e60._0_4_;
          fVar108 = auVar173._4_4_ * (float)local_5d40._4_4_ +
                    auVar171._4_4_ * (float)local_5f40._4_4_ +
                    auVar185._4_4_ * (float)local_5e60._4_4_;
          fVar124 = auVar173._8_4_ * fStack_5d38 +
                    auVar171._8_4_ * fStack_5f38 + auVar185._8_4_ * (float)auStack_5e58._0_4_;
          fVar210 = auVar173._12_4_ * fStack_5d34 +
                    auVar171._12_4_ * fStack_5f34 + auVar185._12_4_ * (float)auStack_5e58._4_4_;
          fVar125 = auVar173._16_4_ * fStack_5d30 +
                    auVar171._16_4_ * fStack_5f30 + auVar185._16_4_ * fStack_5e50;
          fVar126 = auVar173._20_4_ * fStack_5d2c +
                    auVar171._20_4_ * fStack_5f2c + auVar185._20_4_ * fStack_5e4c;
          fVar213 = auVar173._24_4_ * fStack_5d28 +
                    auVar171._24_4_ * fStack_5f28 + auVar185._24_4_ * fStack_5e48;
          fVar214 = auVar189._28_4_ + auVar224._28_4_ + auVar189._28_4_;
          auVar117._0_4_ = fVar241 + fVar241;
          auVar117._4_4_ = fVar108 + fVar108;
          auVar117._8_4_ = fVar124 + fVar124;
          auVar117._12_4_ = fVar210 + fVar210;
          auVar117._16_4_ = fVar125 + fVar125;
          auVar117._20_4_ = fVar126 + fVar126;
          auVar117._24_4_ = fVar213 + fVar213;
          auVar117._28_4_ = fVar214 + fVar214;
          fVar241 = auVar173._0_4_ * fVar199 + auVar171._0_4_ * fVar2 + auVar185._0_4_ * fVar263;
          fVar108 = auVar173._4_4_ * fVar201 + auVar171._4_4_ * fVar10 + auVar185._4_4_ * fVar233;
          fVar124 = auVar173._8_4_ * fVar206 + auVar171._8_4_ * fVar11 + auVar185._8_4_ * fVar236;
          fVar142 = auVar173._12_4_ * fVar223 +
                    auVar171._12_4_ * fVar142 + auVar185._12_4_ * fVar237;
          fVar238 = auVar173._16_4_ * fVar228 +
                    auVar171._16_4_ * fVar146 + auVar185._16_4_ * fVar238;
          fVar146 = auVar173._20_4_ * fVar230 +
                    auVar171._20_4_ * fVar149 + auVar185._20_4_ * fVar239;
          fVar239 = auVar173._24_4_ * fVar232 + auVar171._24_4_ * fVar12 + auVar185._24_4_ * fVar240
          ;
          auVar189 = vrcpps_avx(auVar117);
          fVar263 = auVar189._0_4_;
          fVar2 = auVar189._4_4_;
          auVar79._4_4_ = auVar117._4_4_ * fVar2;
          auVar79._0_4_ = auVar117._0_4_ * fVar263;
          fVar233 = auVar189._8_4_;
          auVar79._8_4_ = auVar117._8_4_ * fVar233;
          fVar10 = auVar189._12_4_;
          auVar79._12_4_ = auVar117._12_4_ * fVar10;
          fVar236 = auVar189._16_4_;
          auVar79._16_4_ = auVar117._16_4_ * fVar236;
          fVar11 = auVar189._20_4_;
          auVar79._20_4_ = auVar117._20_4_ * fVar11;
          fVar237 = auVar189._24_4_;
          auVar79._24_4_ = auVar117._24_4_ * fVar237;
          auVar79._28_4_ = auVar130._28_4_;
          auVar187._8_4_ = 0x3f800000;
          auVar187._0_8_ = &DAT_3f8000003f800000;
          auVar187._12_4_ = 0x3f800000;
          auVar187._16_4_ = 0x3f800000;
          auVar187._20_4_ = 0x3f800000;
          auVar187._24_4_ = 0x3f800000;
          auVar187._28_4_ = 0x3f800000;
          auVar130 = vsubps_avx(auVar187,auVar79);
          auVar80._4_4_ = (fVar108 + fVar108) * (fVar2 + fVar2 * auVar130._4_4_);
          auVar80._0_4_ = (fVar241 + fVar241) * (fVar263 + fVar263 * auVar130._0_4_);
          auVar80._8_4_ = (fVar124 + fVar124) * (fVar233 + fVar233 * auVar130._8_4_);
          auVar80._12_4_ = (fVar142 + fVar142) * (fVar10 + fVar10 * auVar130._12_4_);
          auVar80._16_4_ = (fVar238 + fVar238) * (fVar236 + fVar236 * auVar130._16_4_);
          auVar80._20_4_ = (fVar146 + fVar146) * (fVar11 + fVar11 * auVar130._20_4_);
          auVar80._24_4_ = (fVar239 + fVar239) * (fVar237 + fVar237 * auVar130._24_4_);
          auVar80._28_4_ = auVar189._28_4_ + auVar130._28_4_;
          _local_5f40 = *(undefined1 (*) [32])(ray + 0x100);
          auVar130 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar80,2);
          auVar189 = vcmpps_avx(auVar80,_local_5f40,2);
          auVar130 = vandps_avx(auVar130,auVar189);
          auVar189 = vcmpps_avx(auVar117,_DAT_02020f00,4);
          auVar130 = vandps_avx(auVar189,auVar130);
          auVar151 = vpslld_avx(auVar130._0_16_,0x1f);
          auVar152 = vpsrad_avx(auVar151,0x1f);
          auVar151 = vpslld_avx(auVar130._16_16_,0x1f);
          auVar151 = vpsrad_avx(auVar151,0x1f);
          auVar118._16_16_ = auVar151;
          auVar118._0_16_ = auVar152;
          auVar130 = vandps_avx(auVar172,local_5f00);
          auVar172 = auVar130 & auVar118;
          local_5e00 = auVar153;
          if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar172 >> 0x7f,0) == '\0') &&
                (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar172 >> 0xbf,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar172[0x1f]) goto LAB_0048a92e;
          auVar130 = vandps_avx(auVar118,auVar130);
          uVar5 = *(uint *)(lVar104 + -0x10 + uVar103 * 4);
          auVar100 = (undefined1  [8])(context->scene->geometries).items[uVar5].ptr;
          uVar4 = ((Geometry *)auVar100)->mask;
          auVar134._4_4_ = uVar4;
          auVar134._0_4_ = uVar4;
          auVar134._8_4_ = uVar4;
          auVar134._12_4_ = uVar4;
          auVar134._16_4_ = uVar4;
          auVar134._20_4_ = uVar4;
          auVar134._24_4_ = uVar4;
          auVar134._28_4_ = uVar4;
          auVar172 = vandps_avx(auVar134,*(undefined1 (*) [32])(ray + 0x120));
          auVar151 = vpcmpeqd_avx(auVar172._16_16_,ZEXT816(0) << 0x20);
          auVar152 = vpcmpeqd_avx(auVar172._0_16_,ZEXT816(0) << 0x20);
          auVar175._16_16_ = auVar151;
          auVar175._0_16_ = auVar130._0_16_;
          auVar172 = vblendps_avx(ZEXT1632(auVar152),auVar175,0xf0);
          auVar219 = auVar130 & ~auVar172;
          auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar189 = vcmpps_avx(auVar291,auVar291,0xf);
          auVar292 = ZEXT3264(auVar189);
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0x7f,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0xbf,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar219[0x1f] < '\0') {
            auVar122 = vandnps_avx(auVar172,auVar130);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (((Geometry *)auVar100)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar130 = vrcpps_avx(auVar265);
              fVar263 = auVar130._0_4_;
              fVar2 = auVar130._4_4_;
              auVar84._4_4_ = auVar265._4_4_ * fVar2;
              auVar84._0_4_ = auVar265._0_4_ * fVar263;
              fVar233 = auVar130._8_4_;
              auVar84._8_4_ = auVar265._8_4_ * fVar233;
              fVar10 = auVar130._12_4_;
              auVar84._12_4_ = auVar265._12_4_ * fVar10;
              fVar236 = auVar130._16_4_;
              auVar84._16_4_ = auVar265._16_4_ * fVar236;
              fVar11 = auVar130._20_4_;
              auVar84._20_4_ = auVar265._20_4_ * fVar11;
              fVar237 = auVar130._24_4_;
              auVar84._24_4_ = auVar265._24_4_ * fVar237;
              auVar84._28_4_ = auVar151._12_4_;
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = &DAT_3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar172 = vsubps_avx(auVar190,auVar84);
              auVar135._0_4_ = fVar263 + fVar263 * auVar172._0_4_;
              auVar135._4_4_ = fVar2 + fVar2 * auVar172._4_4_;
              auVar135._8_4_ = fVar233 + fVar233 * auVar172._8_4_;
              auVar135._12_4_ = fVar10 + fVar10 * auVar172._12_4_;
              auVar135._16_4_ = fVar236 + fVar236 * auVar172._16_4_;
              auVar135._20_4_ = fVar11 + fVar11 * auVar172._20_4_;
              auVar135._24_4_ = fVar237 + fVar237 * auVar172._24_4_;
              auVar135._28_4_ = auVar130._28_4_ + auVar172._28_4_;
              auVar177._8_4_ = 0x219392ef;
              auVar177._0_8_ = 0x219392ef219392ef;
              auVar177._12_4_ = 0x219392ef;
              auVar177._16_4_ = 0x219392ef;
              auVar177._20_4_ = 0x219392ef;
              auVar177._24_4_ = 0x219392ef;
              auVar177._28_4_ = 0x219392ef;
              auVar130 = vcmpps_avx(auVar153,auVar177,5);
              auVar153 = vandps_avx(auVar130,auVar135);
              auVar85._4_4_ = auVar153._4_4_ * local_5dc0._4_4_;
              auVar85._0_4_ = auVar153._0_4_ * local_5dc0._0_4_;
              auVar85._8_4_ = auVar153._8_4_ * local_5dc0._8_4_;
              auVar85._12_4_ = auVar153._12_4_ * local_5dc0._12_4_;
              auVar85._16_4_ = auVar153._16_4_ * local_5dc0._16_4_;
              auVar85._20_4_ = auVar153._20_4_ * local_5dc0._20_4_;
              auVar85._24_4_ = auVar153._24_4_ * local_5dc0._24_4_;
              auVar85._28_4_ = auVar130._28_4_;
              auVar130 = vminps_avx(auVar85,auVar190);
              auVar86._4_4_ = auVar153._4_4_ * local_5de0._4_4_;
              auVar86._0_4_ = auVar153._0_4_ * local_5de0._0_4_;
              auVar86._8_4_ = auVar153._8_4_ * local_5de0._8_4_;
              auVar86._12_4_ = auVar153._12_4_ * local_5de0._12_4_;
              auVar86._16_4_ = auVar153._16_4_ * local_5de0._16_4_;
              auVar86._20_4_ = auVar153._20_4_ * local_5de0._20_4_;
              auVar86._24_4_ = auVar153._24_4_ * local_5de0._24_4_;
              auVar86._28_4_ = auVar153._28_4_;
              auVar153 = vminps_avx(auVar86,auVar190);
              auVar172 = vsubps_avx(auVar190,auVar130);
              auVar219 = vsubps_avx(auVar190,auVar153);
              auVar90._8_8_ = uStack_5978;
              auVar90._0_8_ = local_5980;
              auVar90._16_8_ = uStack_5970;
              auVar90._24_8_ = uStack_5968;
              local_5c00 = vblendvps_avx(auVar130,auVar172,auVar90);
              local_5be0 = vblendvps_avx(auVar153,auVar219,auVar90);
              pRVar8 = context->user;
              local_5ba0 = vpshufd_avx(ZEXT416(uVar5),0);
              local_5bc0 = vpshufd_avx(ZEXT416(*(uint *)(lVar104 + uVar103 * 4)),0);
              auVar191 = ZEXT1664(local_5bc0);
              local_5eb8[1] = auVar189;
              *local_5eb8 = auVar189;
              local_5b80 = pRVar8->instID[0];
              local_5b60 = pRVar8->instPrimID[0];
              auVar153 = vblendvps_avx(_local_5f40,auVar80,auVar122);
              *(undefined1 (*) [32])(ray + 0x100) = auVar153;
              local_5eb0.valid = (int *)local_5ee0;
              local_5eb0.geometryUserPtr = ((Geometry *)auVar100)->userPtr;
              local_5eb0.context = context->user;
              local_5eb0.hit = local_5c60;
              local_5eb0.N = 8;
              local_5ee0._0_32_ = auVar122;
              local_5eb0.ray = (RTCRayN *)ray;
              local_5c60 = (RTCHitN  [32])auVar173;
              local_5c40 = auVar185;
              local_5c20 = auVar171;
              local_5bb0 = local_5bc0;
              local_5b90 = local_5ba0;
              uStack_5b7c = local_5b80;
              uStack_5b78 = local_5b80;
              uStack_5b74 = local_5b80;
              uStack_5b70 = local_5b80;
              uStack_5b6c = local_5b80;
              uStack_5b68 = local_5b80;
              uStack_5b64 = local_5b80;
              uStack_5b5c = local_5b60;
              uStack_5b58 = local_5b60;
              uStack_5b54 = local_5b60;
              uStack_5b50 = local_5b60;
              uStack_5b4c = local_5b60;
              uStack_5b48 = local_5b60;
              uStack_5b44 = local_5b60;
              if (((Geometry *)auVar100)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                _auStack_5e58 = auVar225._8_24_;
                local_5e60 = auVar100;
                auVar191 = ZEXT1664(local_5bc0);
                auVar221 = ZEXT1664(auVar171._0_16_);
                auVar234 = ZEXT1664(auVar185._0_16_);
                auVar153 = ZEXT1632(auVar189._0_16_);
                (*((Geometry *)auVar100)->occlusionFilterN)(&local_5eb0);
                auVar153 = vcmpps_avx(auVar153,auVar153,0xf);
                auVar292 = ZEXT3264(auVar153);
                auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar100 = local_5e60;
                uVar105 = local_5f48;
              }
              auVar151 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_5ee0._0_16_);
              auVar152 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_5ee0._16_16_);
              auVar121._16_16_ = auVar152;
              auVar121._0_16_ = auVar151;
              auVar153 = auVar292._0_32_ & ~auVar121;
              if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar153 >> 0x7f,0) == '\0') &&
                    (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar153 >> 0xbf,0) == '\0') &&
                  (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar153[0x1f]) {
                auVar122._0_4_ = auVar292._0_4_ ^ auVar151._0_4_;
                auVar122._4_4_ = auVar292._4_4_ ^ auVar151._4_4_;
                auVar122._8_4_ = auVar292._8_4_ ^ auVar151._8_4_;
                auVar122._12_4_ = auVar292._12_4_ ^ auVar151._12_4_;
                auVar122._16_4_ = auVar292._16_4_ ^ auVar152._0_4_;
                auVar122._20_4_ = auVar292._20_4_ ^ auVar152._4_4_;
                auVar122._24_4_ = auVar292._24_4_ ^ auVar152._8_4_;
                auVar122._28_4_ = auVar292._28_4_ ^ auVar152._12_4_;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((((Geometry *)auVar100)->field_8).field_0x2 & 0x40) != 0)))) {
                  auVar191 = ZEXT1664(auVar191._0_16_);
                  auVar221 = ZEXT1664(auVar221._0_16_);
                  auVar234 = ZEXT1664(auVar234._0_16_);
                  auVar153 = ZEXT1632(auVar292._0_16_);
                  (*p_Var9)(&local_5eb0);
                  auVar153 = vcmpps_avx(auVar153,auVar153,0xf);
                  auVar292 = ZEXT3264(auVar153);
                  auVar248 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar105 = local_5f48;
                }
                auVar151 = vpcmpeqd_avx((undefined1  [16])0x0,local_5ee0._0_16_);
                auVar152 = vpcmpeqd_avx((undefined1  [16])0x0,local_5ee0._16_16_);
                auVar137._16_16_ = auVar152;
                auVar137._0_16_ = auVar151;
                auVar122._0_4_ = auVar292._0_4_ ^ auVar151._0_4_;
                auVar122._4_4_ = auVar292._4_4_ ^ auVar151._4_4_;
                auVar122._8_4_ = auVar292._8_4_ ^ auVar151._8_4_;
                auVar122._12_4_ = auVar292._12_4_ ^ auVar151._12_4_;
                auVar122._16_4_ = auVar292._16_4_ ^ auVar152._0_4_;
                auVar122._20_4_ = auVar292._20_4_ ^ auVar152._4_4_;
                auVar122._24_4_ = auVar292._24_4_ ^ auVar152._8_4_;
                auVar122._28_4_ = auVar292._28_4_ ^ auVar152._12_4_;
                auVar159._8_4_ = 0xff800000;
                auVar159._0_8_ = 0xff800000ff800000;
                auVar159._12_4_ = 0xff800000;
                auVar159._16_4_ = 0xff800000;
                auVar159._20_4_ = 0xff800000;
                auVar159._24_4_ = 0xff800000;
                auVar159._28_4_ = 0xff800000;
                auVar153 = vblendvps_avx(auVar159,*(undefined1 (*) [32])(local_5eb0.ray + 0x100),
                                         auVar137);
                *(undefined1 (*) [32])(local_5eb0.ray + 0x100) = auVar153;
              }
              auVar153 = vblendvps_avx(_local_5f40,*(undefined1 (*) [32])local_5f08,auVar122);
              *(undefined1 (*) [32])local_5f08 = auVar153;
            }
            local_5f00 = vandnps_avx(auVar122,local_5f00);
          }
        }
        bVar107 = (((((((local_5f00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_5f00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_5f00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_5f00 >> 0x7f,0) != '\0') ||
                    (local_5f00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_5f00 >> 0xbf,0) != '\0') ||
                  (local_5f00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_5f00[0x1f] < '\0';
      }
      if ((!bVar107) ||
         (unaff_R15 = uVar103 + 1, bVar107 = 2 < uVar103, uVar103 = unaff_R15, bVar107)) break;
    }
    auVar151 = local_5f00._0_16_;
    auVar131 = vandps_avx(local_5f00,local_5e80);
    auVar153 = local_5e80 & local_5f00;
    if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar153 >> 0x7f,0) == '\0') &&
          (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar153 >> 0xbf,0) == '\0') &&
        (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar153[0x1f])
    break;
  }
  auVar123._0_4_ = auVar292._0_4_ ^ auVar131._0_4_;
  auVar123._4_4_ = auVar292._4_4_ ^ auVar131._4_4_;
  auVar123._8_4_ = auVar292._8_4_ ^ auVar131._8_4_;
  auVar123._12_4_ = auVar292._12_4_ ^ auVar131._12_4_;
  auVar123._16_4_ = auVar292._16_4_ ^ auVar131._16_4_;
  auVar123._20_4_ = auVar292._20_4_ ^ auVar131._20_4_;
  auVar123._24_4_ = auVar292._24_4_ ^ auVar131._24_4_;
  auVar123._28_4_ = auVar292._28_4_ ^ auVar131._28_4_;
LAB_0048ad60:
  _local_5e40 = vorps_avx(auVar123,_local_5e40);
  auVar151 = vpcmpeqd_avx(auVar151,auVar151);
  auVar152 = vpcmpgtd_avx(local_5e40._16_16_,auVar151);
  auVar151 = vpcmpgtd_avx(local_5e40._0_16_,auVar151);
  auVar162 = ZEXT1664(auVar151);
  auVar151 = vpor_avx(auVar151,auVar152);
  if ((((auVar151 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar151 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar151 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar151[0xf]) {
LAB_0048adb4:
    iVar97 = 3;
  }
  else {
    auVar160._8_4_ = 0xff800000;
    auVar160._0_8_ = 0xff800000ff800000;
    auVar160._12_4_ = 0xff800000;
    auVar160._16_4_ = 0xff800000;
    auVar160._20_4_ = 0xff800000;
    auVar160._24_4_ = 0xff800000;
    auVar160._28_4_ = 0xff800000;
    auVar162 = ZEXT3264(auVar160);
    local_59a0 = vblendvps_avx(local_59a0,auVar160,_local_5e40);
    iVar97 = 0;
  }
LAB_0048adb7:
  if (iVar97 == 3) {
    auVar153 = vandps_avx(local_5940,_local_5e40);
    auVar138._8_4_ = 0xff800000;
    auVar138._0_8_ = 0xff800000ff800000;
    auVar138._12_4_ = 0xff800000;
    auVar138._16_4_ = 0xff800000;
    auVar138._20_4_ = 0xff800000;
    auVar138._24_4_ = 0xff800000;
    auVar138._28_4_ = 0xff800000;
    auVar153 = vmaskmovps_avx(auVar153,auVar138);
    *(undefined1 (*) [32])local_5f08 = auVar153;
    return;
  }
  goto LAB_004899f8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }